

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [12];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  uint uVar69;
  uint uVar70;
  ulong uVar71;
  undefined1 (*pauVar72) [32];
  uint uVar73;
  uint uVar74;
  long lVar75;
  ulong uVar76;
  ulong uVar77;
  int iVar78;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar105;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar92 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar109;
  undefined8 extraout_XMM1_Qa;
  float fVar132;
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar131;
  float fVar133;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar130 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar134;
  float fVar153;
  float fVar154;
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar155;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar139 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar156;
  float fVar175;
  float fVar176;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [28];
  float fVar177;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar191;
  float fVar206;
  float fVar208;
  vint4 ai_2;
  undefined1 auVar192 [16];
  float fVar210;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar199 [32];
  float fVar211;
  float fVar219;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar207;
  float fVar209;
  float fVar212;
  float fVar214;
  float fVar216;
  float fVar218;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar220;
  float fVar233;
  float fVar234;
  float fVar237;
  float fVar238;
  float fVar241;
  float fVar242;
  float fVar245;
  float fVar248;
  float fVar251;
  undefined1 auVar224 [32];
  float fVar235;
  float fVar239;
  float fVar243;
  float fVar246;
  float fVar249;
  float fVar252;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar232;
  float fVar236;
  undefined1 auVar221 [16];
  undefined1 auVar230 [32];
  float fVar240;
  float fVar244;
  float fVar247;
  float fVar250;
  undefined1 auVar231 [64];
  float fVar253;
  float fVar260;
  float fVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar263;
  undefined1 auVar257 [32];
  float fVar262;
  float fVar264;
  float fVar266;
  float fVar268;
  float fVar270;
  undefined1 auVar258 [32];
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar259 [64];
  float fVar271;
  float fVar285;
  float fVar289;
  vint4 ai_1;
  undefined1 auVar275 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar311 [16];
  float fVar317;
  float fVar318;
  undefined1 auVar312 [32];
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar313 [64];
  float fVar322;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [64];
  undefined1 auVar323 [16];
  float fVar327;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar328;
  float fVar332;
  float fVar333;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar348;
  float fVar350;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar339;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar360;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar371 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_be8;
  float local_be0;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  RTCFilterFunctionNArguments local_a78;
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  ulong local_940;
  undefined1 auStack_938 [24];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_888;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 auStack_6c0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [28];
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar326 [64];
  undefined1 auVar331 [64];
  
  PVar3 = prim[1];
  uVar76 = (ulong)(byte)PVar3;
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar190 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar111 = vsubps_avx(auVar111,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  auVar135._0_4_ = fVar190 * auVar111._0_4_;
  auVar135._4_4_ = fVar190 * auVar111._4_4_;
  auVar135._8_4_ = fVar190 * auVar111._8_4_;
  auVar135._12_4_ = fVar190 * auVar111._12_4_;
  auVar254._0_4_ = fVar190 * auVar8._0_4_;
  auVar254._4_4_ = fVar190 * auVar8._4_4_;
  auVar254._8_4_ = fVar190 * auVar8._8_4_;
  auVar254._12_4_ = fVar190 * auVar8._12_4_;
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar76 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar77 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + uVar76 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar77 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar79 = vshufps_avx(auVar254,auVar254,0);
  auVar110 = vshufps_avx(auVar254,auVar254,0x55);
  auVar87 = vshufps_avx(auVar254,auVar254,0xaa);
  fVar190 = auVar87._0_4_;
  fVar156 = auVar87._4_4_;
  fVar206 = auVar87._8_4_;
  fVar175 = auVar87._12_4_;
  fVar220 = auVar110._0_4_;
  fVar232 = auVar110._4_4_;
  fVar236 = auVar110._8_4_;
  fVar240 = auVar110._12_4_;
  fVar208 = auVar79._0_4_;
  fVar176 = auVar79._4_4_;
  fVar210 = auVar79._8_4_;
  fVar177 = auVar79._12_4_;
  auVar329._0_4_ = fVar208 * auVar111._0_4_ + fVar220 * auVar8._0_4_ + fVar190 * auVar9._0_4_;
  auVar329._4_4_ = fVar176 * auVar111._4_4_ + fVar232 * auVar8._4_4_ + fVar156 * auVar9._4_4_;
  auVar329._8_4_ = fVar210 * auVar111._8_4_ + fVar236 * auVar8._8_4_ + fVar206 * auVar9._8_4_;
  auVar329._12_4_ = fVar177 * auVar111._12_4_ + fVar240 * auVar8._12_4_ + fVar175 * auVar9._12_4_;
  auVar340._0_4_ = fVar208 * auVar10._0_4_ + fVar220 * auVar167._0_4_ + auVar11._0_4_ * fVar190;
  auVar340._4_4_ = fVar176 * auVar10._4_4_ + fVar232 * auVar167._4_4_ + auVar11._4_4_ * fVar156;
  auVar340._8_4_ = fVar210 * auVar10._8_4_ + fVar236 * auVar167._8_4_ + auVar11._8_4_ * fVar206;
  auVar340._12_4_ = fVar177 * auVar10._12_4_ + fVar240 * auVar167._12_4_ + auVar11._12_4_ * fVar175;
  auVar255._0_4_ = fVar208 * auVar80._0_4_ + fVar220 * auVar81._0_4_ + auVar88._0_4_ * fVar190;
  auVar255._4_4_ = fVar176 * auVar80._4_4_ + fVar232 * auVar81._4_4_ + auVar88._4_4_ * fVar156;
  auVar255._8_4_ = fVar210 * auVar80._8_4_ + fVar236 * auVar81._8_4_ + auVar88._8_4_ * fVar206;
  auVar255._12_4_ = fVar177 * auVar80._12_4_ + fVar240 * auVar81._12_4_ + auVar88._12_4_ * fVar175;
  auVar79 = vshufps_avx(auVar135,auVar135,0);
  auVar110 = vshufps_avx(auVar135,auVar135,0x55);
  auVar87 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar190 = auVar87._0_4_;
  fVar156 = auVar87._4_4_;
  fVar206 = auVar87._8_4_;
  fVar175 = auVar87._12_4_;
  fVar220 = auVar110._0_4_;
  fVar232 = auVar110._4_4_;
  fVar236 = auVar110._8_4_;
  fVar240 = auVar110._12_4_;
  fVar208 = auVar79._0_4_;
  fVar176 = auVar79._4_4_;
  fVar210 = auVar79._8_4_;
  fVar177 = auVar79._12_4_;
  auVar178._0_4_ = fVar208 * auVar111._0_4_ + fVar220 * auVar8._0_4_ + fVar190 * auVar9._0_4_;
  auVar178._4_4_ = fVar176 * auVar111._4_4_ + fVar232 * auVar8._4_4_ + fVar156 * auVar9._4_4_;
  auVar178._8_4_ = fVar210 * auVar111._8_4_ + fVar236 * auVar8._8_4_ + fVar206 * auVar9._8_4_;
  auVar178._12_4_ = fVar177 * auVar111._12_4_ + fVar240 * auVar8._12_4_ + fVar175 * auVar9._12_4_;
  auVar110._0_4_ = fVar208 * auVar10._0_4_ + auVar11._0_4_ * fVar190 + fVar220 * auVar167._0_4_;
  auVar110._4_4_ = fVar176 * auVar10._4_4_ + auVar11._4_4_ * fVar156 + fVar232 * auVar167._4_4_;
  auVar110._8_4_ = fVar210 * auVar10._8_4_ + auVar11._8_4_ * fVar206 + fVar236 * auVar167._8_4_;
  auVar110._12_4_ = fVar177 * auVar10._12_4_ + auVar11._12_4_ * fVar175 + fVar240 * auVar167._12_4_;
  auVar79._0_4_ = fVar208 * auVar80._0_4_ + fVar220 * auVar81._0_4_ + auVar88._0_4_ * fVar190;
  auVar79._4_4_ = fVar176 * auVar80._4_4_ + fVar232 * auVar81._4_4_ + auVar88._4_4_ * fVar156;
  auVar79._8_4_ = fVar210 * auVar80._8_4_ + fVar236 * auVar81._8_4_ + auVar88._8_4_ * fVar206;
  auVar79._12_4_ = fVar177 * auVar80._12_4_ + fVar240 * auVar81._12_4_ + auVar88._12_4_ * fVar175;
  auVar221._8_4_ = 0x7fffffff;
  auVar221._0_8_ = 0x7fffffff7fffffff;
  auVar221._12_4_ = 0x7fffffff;
  auVar111 = vandps_avx(auVar329,auVar221);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar111 = vcmpps_avx(auVar111,auVar157,1);
  auVar8 = vblendvps_avx(auVar329,auVar157,auVar111);
  auVar111 = vandps_avx(auVar340,auVar221);
  auVar111 = vcmpps_avx(auVar111,auVar157,1);
  auVar9 = vblendvps_avx(auVar340,auVar157,auVar111);
  auVar111 = vandps_avx(auVar255,auVar221);
  auVar111 = vcmpps_avx(auVar111,auVar157,1);
  auVar111 = vblendvps_avx(auVar255,auVar157,auVar111);
  auVar10 = vrcpps_avx(auVar8);
  fVar220 = auVar10._0_4_;
  auVar87._0_4_ = fVar220 * auVar8._0_4_;
  fVar232 = auVar10._4_4_;
  auVar87._4_4_ = fVar232 * auVar8._4_4_;
  fVar236 = auVar10._8_4_;
  auVar87._8_4_ = fVar236 * auVar8._8_4_;
  fVar240 = auVar10._12_4_;
  auVar87._12_4_ = fVar240 * auVar8._12_4_;
  auVar256._8_4_ = 0x3f800000;
  auVar256._0_8_ = 0x3f8000003f800000;
  auVar256._12_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar256,auVar87);
  fVar220 = fVar220 + fVar220 * auVar8._0_4_;
  fVar232 = fVar232 + fVar232 * auVar8._4_4_;
  fVar236 = fVar236 + fVar236 * auVar8._8_4_;
  fVar240 = fVar240 + fVar240 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar9);
  fVar190 = auVar8._0_4_;
  auVar192._0_4_ = fVar190 * auVar9._0_4_;
  fVar206 = auVar8._4_4_;
  auVar192._4_4_ = fVar206 * auVar9._4_4_;
  fVar208 = auVar8._8_4_;
  auVar192._8_4_ = fVar208 * auVar9._8_4_;
  fVar210 = auVar8._12_4_;
  auVar192._12_4_ = fVar210 * auVar9._12_4_;
  auVar8 = vsubps_avx(auVar256,auVar192);
  fVar190 = fVar190 + fVar190 * auVar8._0_4_;
  fVar206 = fVar206 + fVar206 * auVar8._4_4_;
  fVar208 = fVar208 + fVar208 * auVar8._8_4_;
  fVar210 = fVar210 + fVar210 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar111);
  fVar156 = auVar8._0_4_;
  auVar158._0_4_ = fVar156 * auVar111._0_4_;
  fVar175 = auVar8._4_4_;
  auVar158._4_4_ = fVar175 * auVar111._4_4_;
  fVar176 = auVar8._8_4_;
  auVar158._8_4_ = fVar176 * auVar111._8_4_;
  fVar177 = auVar8._12_4_;
  auVar158._12_4_ = fVar177 * auVar111._12_4_;
  auVar111 = vsubps_avx(auVar256,auVar158);
  fVar156 = fVar156 + fVar156 * auVar111._0_4_;
  fVar175 = fVar175 + fVar175 * auVar111._4_4_;
  fVar176 = fVar176 + fVar176 * auVar111._8_4_;
  fVar177 = fVar177 + fVar177 * auVar111._12_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar178);
  auVar136._0_4_ = fVar220 * auVar111._0_4_;
  auVar136._4_4_ = fVar232 * auVar111._4_4_;
  auVar136._8_4_ = fVar236 * auVar111._8_4_;
  auVar136._12_4_ = fVar240 * auVar111._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar111 = vpmovsxwd_avx(auVar8);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar178);
  auVar179._0_4_ = fVar220 * auVar111._0_4_;
  auVar179._4_4_ = fVar232 * auVar111._4_4_;
  auVar179._8_4_ = fVar236 * auVar111._8_4_;
  auVar179._12_4_ = fVar240 * auVar111._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar76 * -2 + 6);
  auVar111 = vpmovsxwd_avx(auVar10);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar110);
  auVar275._0_4_ = auVar111._0_4_ * fVar190;
  auVar275._4_4_ = auVar111._4_4_ * fVar206;
  auVar275._8_4_ = auVar111._8_4_ * fVar208;
  auVar275._12_4_ = auVar111._12_4_ * fVar210;
  auVar111 = vcvtdq2ps_avx(auVar8);
  auVar111 = vsubps_avx(auVar111,auVar110);
  auVar88._0_4_ = fVar190 * auVar111._0_4_;
  auVar88._4_4_ = fVar206 * auVar111._4_4_;
  auVar88._8_4_ = fVar208 * auVar111._8_4_;
  auVar88._12_4_ = fVar210 * auVar111._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar77 + uVar76 + 6);
  auVar111 = vpmovsxwd_avx(auVar167);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar79);
  auVar193._0_4_ = auVar111._0_4_ * fVar156;
  auVar193._4_4_ = auVar111._4_4_ * fVar175;
  auVar193._8_4_ = auVar111._8_4_ * fVar176;
  auVar193._12_4_ = auVar111._12_4_ * fVar177;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 6);
  auVar111 = vpmovsxwd_avx(auVar11);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar79);
  auVar80._0_4_ = auVar111._0_4_ * fVar156;
  auVar80._4_4_ = auVar111._4_4_ * fVar175;
  auVar80._8_4_ = auVar111._8_4_ * fVar176;
  auVar80._12_4_ = auVar111._12_4_ * fVar177;
  auVar111 = vpminsd_avx(auVar136,auVar179);
  auVar8 = vpminsd_avx(auVar275,auVar88);
  auVar111 = vmaxps_avx(auVar111,auVar8);
  auVar8 = vpminsd_avx(auVar193,auVar80);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar311._4_4_ = uVar1;
  auVar311._0_4_ = uVar1;
  auVar311._8_4_ = uVar1;
  auVar311._12_4_ = uVar1;
  auVar8 = vmaxps_avx(auVar8,auVar311);
  auVar111 = vmaxps_avx(auVar111,auVar8);
  local_580._0_4_ = auVar111._0_4_ * 0.99999964;
  local_580._4_4_ = auVar111._4_4_ * 0.99999964;
  local_580._8_4_ = auVar111._8_4_ * 0.99999964;
  local_580._12_4_ = auVar111._12_4_ * 0.99999964;
  auVar111 = vpmaxsd_avx(auVar136,auVar179);
  auVar8 = vpmaxsd_avx(auVar275,auVar88);
  auVar111 = vminps_avx(auVar111,auVar8);
  auVar8 = vpmaxsd_avx(auVar193,auVar80);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar90._4_4_ = uVar1;
  auVar90._0_4_ = uVar1;
  auVar90._8_4_ = uVar1;
  auVar90._12_4_ = uVar1;
  auVar8 = vminps_avx(auVar8,auVar90);
  auVar111 = vminps_avx(auVar111,auVar8);
  auVar81._0_4_ = auVar111._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar111._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar111._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar111._12_4_ * 1.0000004;
  auVar111 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar8 = vpcmpgtd_avx(auVar111,_DAT_01f7fcf0);
  auVar111 = vcmpps_avx(local_580,auVar81,2);
  auVar111 = vandps_avx(auVar111,auVar8);
  uVar69 = vmovmskps_avx(auVar111);
  if (uVar69 == 0) {
    return;
  }
  uVar69 = uVar69 & 0xff;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_500 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_888 = prim;
LAB_00ec2a36:
  uVar77 = (ulong)uVar69;
  lVar75 = 0;
  if (uVar77 != 0) {
    for (; (uVar69 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
    }
  }
  uVar77 = uVar77 - 1 & uVar77;
  uVar69 = *(uint *)(local_888 + 2);
  local_940 = (ulong)*(uint *)(local_888 + lVar75 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar69].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_940);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar111 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar76);
  auVar8 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 1) * (long)p_Var5);
  auVar9 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 2) * (long)p_Var5);
  lVar7 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar10 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 3) * (long)p_Var5);
  if (((uVar77 != 0) && (uVar76 = uVar77 - 1 & uVar77, uVar76 != 0)) && (lVar6 = 0, uVar76 != 0)) {
    for (; (uVar76 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar167 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar11 = vinsertps_avx(auVar167,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar190 = *(float *)(ray + k * 4 + 0x40);
  auVar323._4_4_ = fVar190;
  auVar323._0_4_ = fVar190;
  auVar323._8_4_ = fVar190;
  auVar323._12_4_ = fVar190;
  fStack_7d0 = fVar190;
  _local_7e0 = auVar323;
  fStack_7cc = fVar190;
  fStack_7c8 = fVar190;
  fStack_7c4 = fVar190;
  auVar326 = ZEXT3264(_local_7e0);
  fVar156 = *(float *)(ray + k * 4 + 0x50);
  auVar330._4_4_ = fVar156;
  auVar330._0_4_ = fVar156;
  auVar330._8_4_ = fVar156;
  auVar330._12_4_ = fVar156;
  fStack_7b0 = fVar156;
  _local_7c0 = auVar330;
  fStack_7ac = fVar156;
  fStack_7a8 = fVar156;
  fStack_7a4 = fVar156;
  auVar331 = ZEXT3264(_local_7c0);
  auVar167 = vunpcklps_avx(auVar323,auVar330);
  fVar206 = *(float *)(ray + k * 4 + 0x60);
  auVar341._4_4_ = fVar206;
  auVar341._0_4_ = fVar206;
  auVar341._8_4_ = fVar206;
  auVar341._12_4_ = fVar206;
  fStack_7f0 = fVar206;
  _local_800 = auVar341;
  fStack_7ec = fVar206;
  fStack_7e8 = fVar206;
  register0x0000155c = fVar206;
  _local_9d0 = vinsertps_avx(auVar167,auVar341,0x28);
  auVar313 = ZEXT1664(_local_9d0);
  auVar82._0_4_ = (auVar111._0_4_ + auVar8._0_4_ + auVar9._0_4_ + auVar10._0_4_) * 0.25;
  auVar82._4_4_ = (auVar111._4_4_ + auVar8._4_4_ + auVar9._4_4_ + auVar10._4_4_) * 0.25;
  auVar82._8_4_ = (auVar111._8_4_ + auVar8._8_4_ + auVar9._8_4_ + auVar10._8_4_) * 0.25;
  auVar82._12_4_ = (auVar111._12_4_ + auVar8._12_4_ + auVar9._12_4_ + auVar10._12_4_) * 0.25;
  auVar167 = vsubps_avx(auVar82,auVar11);
  auVar167 = vdpps_avx(auVar167,_local_9d0,0x7f);
  local_9e0 = vdpps_avx(_local_9d0,_local_9d0,0x7f);
  auVar321 = ZEXT1664(local_9e0);
  auVar80 = vrcpss_avx(local_9e0,local_9e0);
  fVar175 = auVar167._0_4_ * auVar80._0_4_ * (2.0 - local_9e0._0_4_ * auVar80._0_4_);
  auVar259 = ZEXT464((uint)fVar175);
  auVar80 = vshufps_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),0);
  auVar194._0_4_ = auVar11._0_4_ + local_9d0._0_4_ * auVar80._0_4_;
  auVar194._4_4_ = auVar11._4_4_ + local_9d0._4_4_ * auVar80._4_4_;
  auVar194._8_4_ = auVar11._8_4_ + local_9d0._8_4_ * auVar80._8_4_;
  auVar194._12_4_ = auVar11._12_4_ + local_9d0._12_4_ * auVar80._12_4_;
  auVar167 = vblendps_avx(auVar194,_DAT_01f7aa10,8);
  auVar11 = vsubps_avx(auVar111,auVar167);
  auVar231 = ZEXT1664(auVar11);
  auVar9 = vsubps_avx(auVar9,auVar167);
  auVar81 = vsubps_avx(auVar8,auVar167);
  auVar10 = vsubps_avx(auVar10,auVar167);
  auVar111 = vshufps_avx(auVar11,auVar11,0);
  register0x00001250 = auVar111;
  _local_1e0 = auVar111;
  auVar111 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001250 = auVar111;
  _local_200 = auVar111;
  auVar111 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001250 = auVar111;
  _local_220 = auVar111;
  auVar111 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar111;
  _local_240 = auVar111;
  auVar111 = vshufps_avx(auVar81,auVar81,0);
  register0x00001290 = auVar111;
  _local_3e0 = auVar111;
  auVar111 = vshufps_avx(auVar81,auVar81,0x55);
  register0x00001290 = auVar111;
  _local_260 = auVar111;
  auVar111 = vshufps_avx(auVar81,auVar81,0xaa);
  register0x00001290 = auVar111;
  _local_280 = auVar111;
  auVar111 = vshufps_avx(auVar81,auVar81,0xff);
  register0x00001290 = auVar111;
  _local_2a0 = auVar111;
  auVar111 = vshufps_avx(auVar9,auVar9,0);
  register0x00001290 = auVar111;
  _local_400 = auVar111;
  auVar111 = vshufps_avx(auVar9,auVar9,0x55);
  register0x00001290 = auVar111;
  _local_420 = auVar111;
  auVar111 = vshufps_avx(auVar9,auVar9,0xaa);
  register0x00001290 = auVar111;
  _local_440 = auVar111;
  auVar111 = vshufps_avx(auVar9,auVar9,0xff);
  register0x00001290 = auVar111;
  _local_460 = auVar111;
  auVar111 = vshufps_avx(auVar10,auVar10,0);
  register0x00001290 = auVar111;
  _local_480 = auVar111;
  auVar111 = vshufps_avx(auVar10,auVar10,0x55);
  register0x00001290 = auVar111;
  _local_4a0 = auVar111;
  auVar111 = vshufps_avx(auVar10,auVar10,0xaa);
  register0x00001290 = auVar111;
  _local_4c0 = auVar111;
  auVar111 = vshufps_avx(auVar10,auVar10,0xff);
  local_4e0._16_16_ = auVar111;
  local_4e0._0_16_ = auVar111;
  auVar111 = ZEXT416((uint)(fVar190 * fVar190 + fVar156 * fVar156 + fVar206 * fVar206));
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  local_2c0._16_16_ = auVar111;
  local_2c0._0_16_ = auVar111;
  fVar190 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)fVar175);
  auVar111 = vshufps_avx(ZEXT416((uint)(fVar190 - fVar175)),ZEXT416((uint)(fVar190 - fVar175)),0);
  local_2e0._16_16_ = auVar111;
  local_2e0._0_16_ = auVar111;
  local_750 = vpshufd_avx(ZEXT416(uVar69),0);
  local_760 = vpshufd_avx(ZEXT416(*(uint *)(local_888 + lVar75 * 4 + 6)),0);
  register0x00001210 = auVar80;
  _local_900 = auVar80;
  local_be8 = 1;
  uVar76 = 0;
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  local_520 = vandps_avx(local_2c0,auVar95);
  auVar111 = vsqrtss_avx(local_9e0,local_9e0);
  auVar8 = vsqrtss_avx(local_9e0,local_9e0);
  local_570 = ZEXT816(0x3f80000000000000);
  do {
    auVar199._8_4_ = 0x3f800000;
    auVar199._0_8_ = 0x3f8000003f800000;
    auVar199._12_4_ = 0x3f800000;
    auVar199._16_4_ = 0x3f800000;
    auVar199._20_4_ = 0x3f800000;
    iVar78 = (int)uVar76;
    auVar199._24_4_ = 0x3f800000;
    auVar199._28_4_ = 0x3f800000;
    auVar167 = vmovshdup_avx(local_570);
    auVar88 = vsubps_avx(auVar167,local_570);
    auVar167 = vshufps_avx(local_570,local_570,0);
    local_7a0._16_16_ = auVar167;
    local_7a0._0_16_ = auVar167;
    auVar80 = vshufps_avx(auVar88,auVar88,0);
    fVar109 = auVar80._0_4_;
    fVar131 = auVar80._4_4_;
    fVar132 = auVar80._8_4_;
    fVar133 = auVar80._12_4_;
    fVar134 = auVar167._0_4_;
    auVar171._0_4_ = fVar134 + fVar109 * 0.0;
    fVar153 = auVar167._4_4_;
    auVar171._4_4_ = fVar153 + fVar131 * 0.14285715;
    fVar154 = auVar167._8_4_;
    auVar171._8_4_ = fVar154 + fVar132 * 0.2857143;
    fVar155 = auVar167._12_4_;
    auVar171._12_4_ = fVar155 + fVar133 * 0.42857146;
    auVar171._16_4_ = fVar134 + fVar109 * 0.5714286;
    auVar171._20_4_ = fVar153 + fVar131 * 0.71428573;
    auVar171._24_4_ = fVar154 + fVar132 * 0.8571429;
    auVar171._28_4_ = fVar155 + fVar133;
    auVar94 = vsubps_avx(auVar199,auVar171);
    fVar156 = auVar94._0_4_;
    fVar206 = auVar94._4_4_;
    fVar175 = auVar94._8_4_;
    fVar208 = auVar94._12_4_;
    fVar176 = auVar94._16_4_;
    fVar210 = auVar94._20_4_;
    fVar177 = auVar94._24_4_;
    fVar240 = fVar156 * fVar156 * fVar156;
    fVar233 = fVar206 * fVar206 * fVar206;
    fVar237 = fVar175 * fVar175 * fVar175;
    fVar241 = fVar208 * fVar208 * fVar208;
    fVar244 = fVar176 * fVar176 * fVar176;
    fVar247 = fVar210 * fVar210 * fVar210;
    fVar250 = fVar177 * fVar177 * fVar177;
    fVar253 = auVar171._0_4_ * auVar171._0_4_ * auVar171._0_4_;
    fVar260 = auVar171._4_4_ * auVar171._4_4_ * auVar171._4_4_;
    fVar261 = auVar171._8_4_ * auVar171._8_4_ * auVar171._8_4_;
    fVar263 = auVar171._12_4_ * auVar171._12_4_ * auVar171._12_4_;
    fVar265 = auVar171._16_4_ * auVar171._16_4_ * auVar171._16_4_;
    fVar267 = auVar171._20_4_ * auVar171._20_4_ * auVar171._20_4_;
    fVar269 = auVar171._24_4_ * auVar171._24_4_ * auVar171._24_4_;
    fVar220 = auVar171._0_4_ * fVar156;
    fVar232 = auVar171._4_4_ * fVar206;
    fVar236 = auVar171._8_4_ * fVar175;
    fVar211 = auVar171._12_4_ * fVar208;
    fVar213 = auVar171._16_4_ * fVar176;
    fVar215 = auVar171._20_4_ * fVar210;
    fVar217 = auVar171._24_4_ * fVar177;
    fVar322 = auVar321._28_4_ + auVar331._28_4_;
    fVar309 = auVar259._28_4_ + 1.0 + fVar322;
    fVar317 = fVar322 + auVar231._28_4_ + auVar326._28_4_ + auVar313._28_4_;
    fVar322 = fVar240 * 0.16666667;
    fVar234 = fVar233 * 0.16666667;
    fVar238 = fVar237 * 0.16666667;
    fVar242 = fVar241 * 0.16666667;
    fVar245 = fVar244 * 0.16666667;
    fVar248 = fVar247 * 0.16666667;
    fVar251 = fVar250 * 0.16666667;
    fVar271 = (fVar253 + fVar240 * 4.0 + fVar156 * fVar220 * 12.0 + auVar171._0_4_ * fVar220 * 6.0)
              * 0.16666667;
    fVar285 = (fVar260 + fVar233 * 4.0 + fVar206 * fVar232 * 12.0 + auVar171._4_4_ * fVar232 * 6.0)
              * 0.16666667;
    fVar289 = (fVar261 + fVar237 * 4.0 + fVar175 * fVar236 * 12.0 + auVar171._8_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar293 = (fVar263 + fVar241 * 4.0 + fVar208 * fVar211 * 12.0 + auVar171._12_4_ * fVar211 * 6.0)
              * 0.16666667;
    fVar297 = (fVar265 + fVar244 * 4.0 + fVar176 * fVar213 * 12.0 + auVar171._16_4_ * fVar213 * 6.0)
              * 0.16666667;
    fVar301 = (fVar267 + fVar247 * 4.0 + fVar210 * fVar215 * 12.0 + auVar171._20_4_ * fVar215 * 6.0)
              * 0.16666667;
    fVar305 = (fVar269 + fVar250 * 4.0 + fVar177 * fVar217 * 12.0 + auVar171._24_4_ * fVar217 * 6.0)
              * 0.16666667;
    fVar240 = (fVar253 * 4.0 + fVar240 + auVar171._0_4_ * fVar220 * 12.0 + fVar156 * fVar220 * 6.0)
              * 0.16666667;
    fVar233 = (fVar260 * 4.0 + fVar233 + auVar171._4_4_ * fVar232 * 12.0 + fVar206 * fVar232 * 6.0)
              * 0.16666667;
    fVar237 = (fVar261 * 4.0 + fVar237 + auVar171._8_4_ * fVar236 * 12.0 + fVar175 * fVar236 * 6.0)
              * 0.16666667;
    fVar241 = (fVar263 * 4.0 + fVar241 + auVar171._12_4_ * fVar211 * 12.0 + fVar208 * fVar211 * 6.0)
              * 0.16666667;
    fVar244 = (fVar265 * 4.0 + fVar244 + auVar171._16_4_ * fVar213 * 12.0 + fVar176 * fVar213 * 6.0)
              * 0.16666667;
    fVar247 = (fVar267 * 4.0 + fVar247 + auVar171._20_4_ * fVar215 * 12.0 + fVar210 * fVar215 * 6.0)
              * 0.16666667;
    fVar250 = (fVar269 * 4.0 + fVar250 + auVar171._24_4_ * fVar217 * 12.0 + fVar177 * fVar217 * 6.0)
              * 0.16666667;
    fVar253 = fVar253 * 0.16666667;
    fVar260 = fVar260 * 0.16666667;
    fVar261 = fVar261 * 0.16666667;
    fVar263 = fVar263 * 0.16666667;
    fVar265 = fVar265 * 0.16666667;
    fVar267 = fVar267 * 0.16666667;
    fVar269 = fVar269 * 0.16666667;
    fVar327 = auVar326._28_4_ + 12.0;
    fVar318 = fVar317 + 12.166667;
    fVar272 = (float)local_1e0._0_4_ * fVar322 +
              fVar271 * (float)local_3e0._0_4_ +
              fVar253 * (float)local_480._0_4_ + fVar240 * (float)local_400._0_4_;
    fVar286 = (float)local_1e0._4_4_ * fVar234 +
              fVar285 * (float)local_3e0._4_4_ +
              fVar260 * (float)local_480._4_4_ + fVar233 * (float)local_400._4_4_;
    fVar290 = fStack_1d8 * fVar238 +
              fVar289 * fStack_3d8 + fVar261 * fStack_478 + fVar237 * fStack_3f8;
    fVar294 = fStack_1d4 * fVar242 +
              fVar293 * fStack_3d4 + fVar263 * fStack_474 + fVar241 * fStack_3f4;
    fVar298 = fStack_1d0 * fVar245 +
              fVar297 * fStack_3d0 + fVar265 * fStack_470 + fVar244 * fStack_3f0;
    fVar302 = fStack_1cc * fVar248 +
              fVar301 * fStack_3cc + fVar267 * fStack_46c + fVar247 * fStack_3ec;
    fVar306 = fStack_1c8 * fVar251 +
              fVar305 * fStack_3c8 + fVar269 * fStack_468 + fVar250 * fStack_3e8;
    fVar310 = fVar309 + fVar318;
    local_980 = (float)local_200._0_4_ * fVar322 +
                (float)local_260._0_4_ * fVar271 +
                fVar253 * (float)local_4a0._0_4_ + fVar240 * (float)local_420._0_4_;
    fStack_97c = (float)local_200._4_4_ * fVar234 +
                 (float)local_260._4_4_ * fVar285 +
                 fVar260 * (float)local_4a0._4_4_ + fVar233 * (float)local_420._4_4_;
    fStack_978 = fStack_1f8 * fVar238 +
                 fStack_258 * fVar289 + fVar261 * fStack_498 + fVar237 * fStack_418;
    fStack_974 = fStack_1f4 * fVar242 +
                 fStack_254 * fVar293 + fVar263 * fStack_494 + fVar241 * fStack_414;
    fStack_970 = fStack_1f0 * fVar245 +
                 fStack_250 * fVar297 + fVar265 * fStack_490 + fVar244 * fStack_410;
    fStack_96c = fStack_1ec * fVar248 +
                 fStack_24c * fVar301 + fVar267 * fStack_48c + fVar247 * fStack_40c;
    fStack_968 = fStack_1e8 * fVar251 +
                 fStack_248 * fVar305 + fVar269 * fStack_488 + fVar250 * fStack_408;
    fStack_964 = fVar310 + fVar327 + 12.166667;
    local_960 = (float)local_220._0_4_ * fVar322 +
                (float)local_280._0_4_ * fVar271 +
                fVar253 * (float)local_4c0._0_4_ + fVar240 * (float)local_440._0_4_;
    fStack_95c = (float)local_220._4_4_ * fVar234 +
                 (float)local_280._4_4_ * fVar285 +
                 fVar260 * (float)local_4c0._4_4_ + fVar233 * (float)local_440._4_4_;
    fStack_958 = fStack_218 * fVar238 +
                 fStack_278 * fVar289 + fVar261 * fStack_4b8 + fVar237 * fStack_438;
    fStack_954 = fStack_214 * fVar242 +
                 fStack_274 * fVar293 + fVar263 * fStack_4b4 + fVar241 * fStack_434;
    fStack_950 = fStack_210 * fVar245 +
                 fStack_270 * fVar297 + fVar265 * fStack_4b0 + fVar244 * fStack_430;
    fStack_94c = fStack_20c * fVar248 +
                 fStack_26c * fVar301 + fVar267 * fStack_4ac + fVar247 * fStack_42c;
    fStack_948 = fStack_208 * fVar251 +
                 fStack_268 * fVar305 + fVar269 * fStack_4a8 + fVar250 * fStack_428;
    fStack_944 = fStack_964 + fVar327 + auVar331._28_4_ + 12.0;
    local_ba0._0_4_ =
         (float)local_240._0_4_ * fVar322 +
         (float)local_2a0._0_4_ * fVar271 +
         fVar240 * (float)local_460._0_4_ + local_4e0._0_4_ * fVar253;
    local_ba0._4_4_ =
         (float)local_240._4_4_ * fVar234 +
         (float)local_2a0._4_4_ * fVar285 +
         fVar233 * (float)local_460._4_4_ + local_4e0._4_4_ * fVar260;
    fStack_b98 = fStack_238 * fVar238 +
                 fStack_298 * fVar289 + fVar237 * fStack_458 + local_4e0._8_4_ * fVar261;
    fStack_b94 = fStack_234 * fVar242 +
                 fStack_294 * fVar293 + fVar241 * fStack_454 + local_4e0._12_4_ * fVar263;
    fStack_b90 = fStack_230 * fVar245 +
                 fStack_290 * fVar297 + fVar244 * fStack_450 + local_4e0._16_4_ * fVar265;
    fStack_b8c = fStack_22c * fVar248 +
                 fStack_28c * fVar301 + fVar247 * fStack_44c + local_4e0._20_4_ * fVar267;
    fStack_b88 = fStack_228 * fVar251 +
                 fStack_288 * fVar305 + fVar250 * fStack_448 + local_4e0._24_4_ * fVar269;
    fStack_b84 = auVar231._28_4_ + fVar309 + fVar317 + auVar259._28_4_;
    auVar19._4_4_ = auVar171._4_4_ * -auVar171._4_4_;
    auVar19._0_4_ = auVar171._0_4_ * -auVar171._0_4_;
    auVar19._8_4_ = auVar171._8_4_ * -auVar171._8_4_;
    auVar19._12_4_ = auVar171._12_4_ * -auVar171._12_4_;
    auVar19._16_4_ = auVar171._16_4_ * -auVar171._16_4_;
    auVar19._20_4_ = auVar171._20_4_ * -auVar171._20_4_;
    auVar19._24_4_ = auVar171._24_4_ * -auVar171._24_4_;
    auVar19._28_4_ = auVar171._28_4_;
    auVar345._4_4_ = fVar232 * 4.0;
    auVar345._0_4_ = fVar220 * 4.0;
    auVar345._8_4_ = fVar236 * 4.0;
    auVar345._12_4_ = fVar211 * 4.0;
    auVar345._16_4_ = fVar213 * 4.0;
    auVar345._20_4_ = fVar215 * 4.0;
    auVar345._24_4_ = fVar217 * 4.0;
    auVar345._28_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar19,auVar345);
    fVar250 = fVar156 * -fVar156 * 0.5;
    fVar251 = fVar206 * -fVar206 * 0.5;
    fVar253 = fVar175 * -fVar175 * 0.5;
    fVar260 = fVar208 * -fVar208 * 0.5;
    fVar261 = fVar176 * -fVar176 * 0.5;
    fVar263 = fVar210 * -fVar210 * 0.5;
    fVar265 = fVar177 * -fVar177 * 0.5;
    fVar237 = auVar94._0_4_ * 0.5;
    fVar241 = auVar94._4_4_ * 0.5;
    fVar242 = auVar94._8_4_ * 0.5;
    fVar244 = auVar94._12_4_ * 0.5;
    fVar245 = auVar94._16_4_ * 0.5;
    fVar247 = auVar94._20_4_ * 0.5;
    fVar248 = auVar94._24_4_ * 0.5;
    fVar240 = (fVar156 * fVar156 + fVar220 * 4.0) * 0.5;
    fVar322 = (fVar206 * fVar206 + fVar232 * 4.0) * 0.5;
    fVar233 = (fVar175 * fVar175 + fVar236 * 4.0) * 0.5;
    fVar234 = (fVar208 * fVar208 + fVar211 * 4.0) * 0.5;
    fVar213 = (fVar176 * fVar176 + fVar213 * 4.0) * 0.5;
    fVar238 = (fVar210 * fVar210 + fVar215 * 4.0) * 0.5;
    fVar217 = (fVar177 * fVar177 + fVar217 * 4.0) * 0.5;
    fVar156 = auVar171._0_4_ * auVar171._0_4_ * 0.5;
    fVar206 = auVar171._4_4_ * auVar171._4_4_ * 0.5;
    fVar175 = auVar171._8_4_ * auVar171._8_4_ * 0.5;
    fVar208 = auVar171._12_4_ * auVar171._12_4_ * 0.5;
    fVar220 = auVar171._16_4_ * auVar171._16_4_ * 0.5;
    fVar232 = auVar171._20_4_ * auVar171._20_4_ * 0.5;
    fVar236 = auVar171._24_4_ * auVar171._24_4_ * 0.5;
    fVar318 = fStack_964 + fVar318;
    auVar167 = vpermilps_avx(ZEXT416((uint)(auVar88._0_4_ * 0.04761905)),0);
    fVar176 = auVar167._0_4_;
    fVar273 = fVar176 * ((float)local_1e0._0_4_ * fVar250 +
                        fVar237 * (float)local_3e0._0_4_ +
                        fVar240 * (float)local_400._0_4_ + fVar156 * (float)local_480._0_4_);
    fVar177 = auVar167._4_4_;
    fVar287 = fVar177 * ((float)local_1e0._4_4_ * fVar251 +
                        fVar241 * (float)local_3e0._4_4_ +
                        fVar322 * (float)local_400._4_4_ + fVar206 * (float)local_480._4_4_);
    auVar344._4_4_ = fVar287;
    auVar344._0_4_ = fVar273;
    fVar211 = auVar167._8_4_;
    fVar291 = fVar211 * (fStack_1d8 * fVar253 +
                        fVar242 * fStack_3d8 + fVar233 * fStack_3f8 + fVar175 * fStack_478);
    auVar344._8_4_ = fVar291;
    fVar215 = auVar167._12_4_;
    fVar295 = fVar215 * (fStack_1d4 * fVar260 +
                        fVar244 * fStack_3d4 + fVar234 * fStack_3f4 + fVar208 * fStack_474);
    auVar344._12_4_ = fVar295;
    fVar299 = fVar176 * (fStack_1d0 * fVar261 +
                        fVar245 * fStack_3d0 + fVar213 * fStack_3f0 + fVar220 * fStack_470);
    auVar344._16_4_ = fVar299;
    fVar303 = fVar177 * (fStack_1cc * fVar263 +
                        fVar247 * fStack_3cc + fVar238 * fStack_3ec + fVar232 * fStack_46c);
    auVar344._20_4_ = fVar303;
    fVar307 = fVar211 * (fStack_1c8 * fVar265 +
                        fVar248 * fStack_3c8 + fVar217 * fStack_3e8 + fVar236 * fStack_468);
    auVar344._24_4_ = fVar307;
    auVar344._28_4_ = fVar318;
    fVar328 = fVar176 * ((float)local_200._0_4_ * fVar250 +
                        (float)local_260._0_4_ * fVar237 +
                        fVar240 * (float)local_420._0_4_ + fVar156 * (float)local_4a0._0_4_);
    fVar332 = fVar177 * ((float)local_200._4_4_ * fVar251 +
                        (float)local_260._4_4_ * fVar241 +
                        fVar322 * (float)local_420._4_4_ + fVar206 * (float)local_4a0._4_4_);
    auVar20._4_4_ = fVar332;
    auVar20._0_4_ = fVar328;
    fVar333 = fVar211 * (fStack_1f8 * fVar253 +
                        fStack_258 * fVar242 + fVar233 * fStack_418 + fVar175 * fStack_498);
    auVar20._8_4_ = fVar333;
    fVar334 = fVar215 * (fStack_1f4 * fVar260 +
                        fStack_254 * fVar244 + fVar234 * fStack_414 + fVar208 * fStack_494);
    auVar20._12_4_ = fVar334;
    fVar335 = fVar176 * (fStack_1f0 * fVar261 +
                        fStack_250 * fVar245 + fVar213 * fStack_410 + fVar220 * fStack_490);
    auVar20._16_4_ = fVar335;
    fVar336 = fVar177 * (fStack_1ec * fVar263 +
                        fStack_24c * fVar247 + fVar238 * fStack_40c + fVar232 * fStack_48c);
    auVar20._20_4_ = fVar336;
    fVar337 = fVar211 * (fStack_1e8 * fVar265 +
                        fStack_248 * fVar248 + fVar217 * fStack_408 + fVar236 * fStack_488);
    auVar20._24_4_ = fVar337;
    auVar20._28_4_ = uStack_1c4;
    fVar338 = fVar176 * ((float)local_220._0_4_ * fVar250 +
                        fVar156 * (float)local_4c0._0_4_ + fVar240 * (float)local_440._0_4_ +
                        (float)local_280._0_4_ * fVar237);
    fVar348 = fVar177 * ((float)local_220._4_4_ * fVar251 +
                        fVar206 * (float)local_4c0._4_4_ + fVar322 * (float)local_440._4_4_ +
                        (float)local_280._4_4_ * fVar241);
    auVar16._4_4_ = fVar348;
    auVar16._0_4_ = fVar338;
    fVar350 = fVar211 * (fStack_218 * fVar253 +
                        fVar175 * fStack_4b8 + fVar233 * fStack_438 + fStack_278 * fVar242);
    auVar16._8_4_ = fVar350;
    fVar352 = fVar215 * (fStack_214 * fVar260 +
                        fVar208 * fStack_4b4 + fVar234 * fStack_434 + fStack_274 * fVar244);
    auVar16._12_4_ = fVar352;
    fVar354 = fVar176 * (fStack_210 * fVar261 +
                        fVar220 * fStack_4b0 + fVar213 * fStack_430 + fStack_270 * fVar245);
    auVar16._16_4_ = fVar354;
    fVar356 = fVar177 * (fStack_20c * fVar263 +
                        fVar232 * fStack_4ac + fVar238 * fStack_42c + fStack_26c * fVar247);
    auVar16._20_4_ = fVar356;
    fVar358 = fVar211 * (fStack_208 * fVar265 +
                        fVar236 * fStack_4a8 + fVar217 * fStack_428 + fStack_268 * fVar248);
    auVar16._24_4_ = fVar358;
    auVar16._28_4_ = uStack_1e4;
    fVar210 = fVar176 * ((float)local_240._0_4_ * fVar250 +
                        (float)local_2a0._0_4_ * fVar237 +
                        fVar156 * local_4e0._0_4_ + fVar240 * (float)local_460._0_4_);
    fVar240 = fVar177 * ((float)local_240._4_4_ * fVar251 +
                        (float)local_2a0._4_4_ * fVar241 +
                        fVar206 * local_4e0._4_4_ + fVar322 * (float)local_460._4_4_);
    auVar123._4_4_ = fVar240;
    auVar123._0_4_ = fVar210;
    fVar322 = fVar211 * (fStack_238 * fVar253 +
                        fStack_298 * fVar242 + fVar175 * local_4e0._8_4_ + fVar233 * fStack_458);
    auVar123._8_4_ = fVar322;
    fVar237 = fVar215 * (fStack_234 * fVar260 +
                        fStack_294 * fVar244 + fVar208 * local_4e0._12_4_ + fVar234 * fStack_454);
    auVar123._12_4_ = fVar237;
    fVar176 = fVar176 * (fStack_230 * fVar261 +
                        fStack_290 * fVar245 + fVar220 * local_4e0._16_4_ + fVar213 * fStack_450);
    auVar123._16_4_ = fVar176;
    fVar177 = fVar177 * (fStack_22c * fVar263 +
                        fStack_28c * fVar247 + fVar232 * local_4e0._20_4_ + fVar238 * fStack_44c);
    auVar123._20_4_ = fVar177;
    fVar211 = fVar211 * (fStack_228 * fVar265 +
                        fStack_288 * fVar248 + fVar236 * local_4e0._24_4_ + fVar217 * fStack_448);
    auVar123._24_4_ = fVar211;
    auVar123._28_4_ = fVar215;
    auVar65._4_4_ = fStack_97c;
    auVar65._0_4_ = local_980;
    auVar65._8_4_ = fStack_978;
    auVar65._12_4_ = fStack_974;
    auVar65._16_4_ = fStack_970;
    auVar65._20_4_ = fStack_96c;
    auVar65._24_4_ = fStack_968;
    auVar65._28_4_ = fStack_964;
    auVar94 = vperm2f128_avx(auVar65,auVar65,1);
    auVar94 = vshufps_avx(auVar94,auVar65,0x30);
    auVar345 = vshufps_avx(auVar65,auVar94,0x29);
    auVar66._4_4_ = fStack_95c;
    auVar66._0_4_ = local_960;
    auVar66._8_4_ = fStack_958;
    auVar66._12_4_ = fStack_954;
    auVar66._16_4_ = fStack_950;
    auVar66._20_4_ = fStack_94c;
    auVar66._24_4_ = fStack_948;
    auVar66._28_4_ = fStack_944;
    auVar94 = vperm2f128_avx(auVar66,auVar66,1);
    auVar94 = vshufps_avx(auVar94,auVar66,0x30);
    local_a40 = vshufps_avx(auVar66,auVar94,0x29);
    auVar95 = vsubps_avx(_local_ba0,auVar123);
    auVar94 = vperm2f128_avx(auVar95,auVar95,1);
    auVar94 = vshufps_avx(auVar94,auVar95,0x30);
    auVar123 = vshufps_avx(auVar95,auVar94,0x29);
    local_620 = vsubps_avx(auVar345,auVar65);
    local_600 = vsubps_avx(local_a40,auVar66);
    fVar206 = local_620._0_4_;
    fVar220 = local_620._4_4_;
    auVar12._4_4_ = fVar348 * fVar220;
    auVar12._0_4_ = fVar338 * fVar206;
    fVar233 = local_620._8_4_;
    auVar12._8_4_ = fVar350 * fVar233;
    fVar217 = local_620._12_4_;
    auVar12._12_4_ = fVar352 * fVar217;
    fVar248 = local_620._16_4_;
    auVar12._16_4_ = fVar354 * fVar248;
    fVar263 = local_620._20_4_;
    auVar12._20_4_ = fVar356 * fVar263;
    fVar289 = local_620._24_4_;
    auVar12._24_4_ = fVar358 * fVar289;
    auVar12._28_4_ = auVar95._28_4_;
    fVar175 = local_600._0_4_;
    fVar232 = local_600._4_4_;
    auVar144._4_4_ = fVar332 * fVar232;
    auVar144._0_4_ = fVar328 * fVar175;
    fVar234 = local_600._8_4_;
    auVar144._8_4_ = fVar333 * fVar234;
    fVar241 = local_600._12_4_;
    auVar144._12_4_ = fVar334 * fVar241;
    fVar250 = local_600._16_4_;
    auVar144._16_4_ = fVar335 * fVar250;
    fVar265 = local_600._20_4_;
    auVar144._20_4_ = fVar336 * fVar265;
    fVar293 = local_600._24_4_;
    auVar144._24_4_ = fVar337 * fVar293;
    auVar144._28_4_ = auVar94._28_4_;
    auVar144 = vsubps_avx(auVar144,auVar12);
    auVar61._4_4_ = fVar286;
    auVar61._0_4_ = fVar272;
    auVar61._8_4_ = fVar290;
    auVar61._12_4_ = fVar294;
    auVar61._16_4_ = fVar298;
    auVar61._20_4_ = fVar302;
    auVar61._24_4_ = fVar306;
    auVar61._28_4_ = fVar310;
    auVar94 = vperm2f128_avx(auVar61,auVar61,1);
    auVar94 = vshufps_avx(auVar94,auVar61,0x30);
    auVar12 = vshufps_avx(auVar61,auVar94,0x29);
    _local_640 = vsubps_avx(auVar12,auVar61);
    auVar13._4_4_ = fVar287 * fVar232;
    auVar13._0_4_ = fVar273 * fVar175;
    auVar13._8_4_ = fVar291 * fVar234;
    auVar13._12_4_ = fVar295 * fVar241;
    auVar13._16_4_ = fVar299 * fVar250;
    auVar13._20_4_ = fVar303 * fVar265;
    auVar13._24_4_ = fVar307 * fVar293;
    auVar13._28_4_ = auVar12._28_4_;
    fVar208 = local_640._0_4_;
    fVar236 = local_640._4_4_;
    auVar14._4_4_ = fVar348 * fVar236;
    auVar14._0_4_ = fVar338 * fVar208;
    fVar213 = local_640._8_4_;
    auVar14._8_4_ = fVar350 * fVar213;
    fVar242 = local_640._12_4_;
    auVar14._12_4_ = fVar352 * fVar242;
    fVar251 = local_640._16_4_;
    auVar14._16_4_ = fVar354 * fVar251;
    fVar267 = local_640._20_4_;
    auVar14._20_4_ = fVar356 * fVar267;
    fVar297 = local_640._24_4_;
    auVar14._24_4_ = fVar358 * fVar297;
    auVar14._28_4_ = fVar310;
    auVar13 = vsubps_avx(auVar14,auVar13);
    auVar15._4_4_ = fVar332 * fVar236;
    auVar15._0_4_ = fVar328 * fVar208;
    auVar15._8_4_ = fVar333 * fVar213;
    auVar15._12_4_ = fVar334 * fVar242;
    auVar15._16_4_ = fVar335 * fVar251;
    auVar15._20_4_ = fVar336 * fVar267;
    auVar15._24_4_ = fVar337 * fVar297;
    auVar15._28_4_ = fVar310;
    auVar278._4_4_ = fVar287 * fVar220;
    auVar278._0_4_ = fVar273 * fVar206;
    auVar278._8_4_ = fVar291 * fVar233;
    auVar278._12_4_ = fVar295 * fVar217;
    auVar278._16_4_ = fVar299 * fVar248;
    auVar278._20_4_ = fVar303 * fVar263;
    auVar278._24_4_ = fVar307 * fVar289;
    auVar278._28_4_ = uStack_204;
    auVar14 = vsubps_avx(auVar278,auVar15);
    fVar156 = auVar14._28_4_;
    auVar122._0_4_ = fVar208 * fVar208 + fVar206 * fVar206 + fVar175 * fVar175;
    auVar122._4_4_ = fVar236 * fVar236 + fVar220 * fVar220 + fVar232 * fVar232;
    auVar122._8_4_ = fVar213 * fVar213 + fVar233 * fVar233 + fVar234 * fVar234;
    auVar122._12_4_ = fVar242 * fVar242 + fVar217 * fVar217 + fVar241 * fVar241;
    auVar122._16_4_ = fVar251 * fVar251 + fVar248 * fVar248 + fVar250 * fVar250;
    auVar122._20_4_ = fVar267 * fVar267 + fVar263 * fVar263 + fVar265 * fVar265;
    auVar122._24_4_ = fVar297 * fVar297 + fVar289 * fVar289 + fVar293 * fVar293;
    auVar122._28_4_ = fVar156 + fVar156 + auVar144._28_4_;
    auVar94 = vrcpps_avx(auVar122);
    fVar238 = auVar94._0_4_;
    fVar244 = auVar94._4_4_;
    auVar17._4_4_ = fVar244 * auVar122._4_4_;
    auVar17._0_4_ = fVar238 * auVar122._0_4_;
    fVar245 = auVar94._8_4_;
    auVar17._8_4_ = fVar245 * auVar122._8_4_;
    fVar247 = auVar94._12_4_;
    auVar17._12_4_ = fVar247 * auVar122._12_4_;
    fVar253 = auVar94._16_4_;
    auVar17._16_4_ = fVar253 * auVar122._16_4_;
    fVar260 = auVar94._20_4_;
    auVar17._20_4_ = fVar260 * auVar122._20_4_;
    fVar261 = auVar94._24_4_;
    auVar17._24_4_ = fVar261 * auVar122._24_4_;
    auVar17._28_4_ = uStack_204;
    auVar361._8_4_ = 0x3f800000;
    auVar361._0_8_ = 0x3f8000003f800000;
    auVar361._12_4_ = 0x3f800000;
    auVar361._16_4_ = 0x3f800000;
    auVar361._20_4_ = 0x3f800000;
    auVar361._24_4_ = 0x3f800000;
    auVar361._28_4_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar361,auVar17);
    fVar238 = auVar15._0_4_ * fVar238 + fVar238;
    fVar244 = auVar15._4_4_ * fVar244 + fVar244;
    fVar245 = auVar15._8_4_ * fVar245 + fVar245;
    fVar247 = auVar15._12_4_ * fVar247 + fVar247;
    fVar253 = auVar15._16_4_ * fVar253 + fVar253;
    fVar260 = auVar15._20_4_ * fVar260 + fVar260;
    fVar261 = auVar15._24_4_ * fVar261 + fVar261;
    auVar95 = vperm2f128_avx(auVar20,auVar20,1);
    auVar95 = vshufps_avx(auVar95,auVar20,0x30);
    auVar95 = vshufps_avx(auVar20,auVar95,0x29);
    auVar19 = vperm2f128_avx(auVar16,auVar16,1);
    auVar19 = vshufps_avx(auVar19,auVar16,0x30);
    local_780 = vshufps_avx(auVar16,auVar19,0x29);
    fVar339 = local_780._0_4_;
    fVar349 = local_780._4_4_;
    auVar18._4_4_ = fVar349 * fVar220;
    auVar18._0_4_ = fVar339 * fVar206;
    fVar351 = local_780._8_4_;
    auVar18._8_4_ = fVar351 * fVar233;
    fVar353 = local_780._12_4_;
    auVar18._12_4_ = fVar353 * fVar217;
    fVar355 = local_780._16_4_;
    auVar18._16_4_ = fVar355 * fVar248;
    fVar357 = local_780._20_4_;
    auVar18._20_4_ = fVar357 * fVar263;
    fVar359 = local_780._24_4_;
    auVar18._24_4_ = fVar359 * fVar289;
    auVar18._28_4_ = auVar19._28_4_;
    fVar360 = auVar95._0_4_;
    fVar365 = auVar95._4_4_;
    auVar21._4_4_ = fVar365 * fVar232;
    auVar21._0_4_ = fVar360 * fVar175;
    fVar366 = auVar95._8_4_;
    auVar21._8_4_ = fVar366 * fVar234;
    fVar367 = auVar95._12_4_;
    auVar21._12_4_ = fVar367 * fVar241;
    fVar368 = auVar95._16_4_;
    auVar21._16_4_ = fVar368 * fVar250;
    fVar369 = auVar95._20_4_;
    auVar21._20_4_ = fVar369 * fVar265;
    fVar370 = auVar95._24_4_;
    auVar21._24_4_ = fVar370 * fVar293;
    auVar21._28_4_ = uStack_1c4;
    auVar16 = vsubps_avx(auVar21,auVar18);
    auVar19 = vperm2f128_avx(auVar344,auVar344,1);
    auVar19 = vshufps_avx(auVar19,auVar344,0x30);
    local_a00 = vshufps_avx(auVar344,auVar19,0x29);
    fVar274 = local_a00._0_4_;
    fVar288 = local_a00._4_4_;
    auVar22._4_4_ = fVar288 * fVar232;
    auVar22._0_4_ = fVar274 * fVar175;
    fVar292 = local_a00._8_4_;
    auVar22._8_4_ = fVar292 * fVar234;
    fVar296 = local_a00._12_4_;
    auVar22._12_4_ = fVar296 * fVar241;
    fVar300 = local_a00._16_4_;
    auVar22._16_4_ = fVar300 * fVar250;
    fVar304 = local_a00._20_4_;
    auVar22._20_4_ = fVar304 * fVar265;
    fVar308 = local_a00._24_4_;
    auVar22._24_4_ = fVar308 * fVar293;
    auVar22._28_4_ = auVar19._28_4_;
    auVar23._4_4_ = fVar349 * fVar236;
    auVar23._0_4_ = fVar339 * fVar208;
    auVar23._8_4_ = fVar351 * fVar213;
    auVar23._12_4_ = fVar353 * fVar242;
    auVar23._16_4_ = fVar355 * fVar251;
    auVar23._20_4_ = fVar357 * fVar267;
    uVar73 = local_780._28_4_;
    auVar23._24_4_ = fVar359 * fVar297;
    auVar23._28_4_ = uVar73;
    auVar19 = vsubps_avx(auVar23,auVar22);
    auVar24._4_4_ = fVar365 * fVar236;
    auVar24._0_4_ = fVar360 * fVar208;
    auVar24._8_4_ = fVar366 * fVar213;
    auVar24._12_4_ = fVar367 * fVar242;
    auVar24._16_4_ = fVar368 * fVar251;
    auVar24._20_4_ = fVar369 * fVar267;
    auVar24._24_4_ = fVar370 * fVar297;
    auVar24._28_4_ = uVar73;
    auVar25._4_4_ = fVar288 * fVar220;
    auVar25._0_4_ = fVar274 * fVar206;
    auVar25._8_4_ = fVar292 * fVar233;
    auVar25._12_4_ = fVar296 * fVar217;
    auVar25._16_4_ = fVar300 * fVar248;
    auVar25._20_4_ = fVar304 * fVar263;
    fVar317 = auVar95._28_4_;
    auVar25._24_4_ = fVar308 * fVar289;
    auVar25._28_4_ = fVar317;
    auVar344 = vsubps_avx(auVar25,auVar24);
    auVar26._4_4_ =
         (auVar144._4_4_ * auVar144._4_4_ +
         auVar13._4_4_ * auVar13._4_4_ + auVar14._4_4_ * auVar14._4_4_) * fVar244;
    auVar26._0_4_ =
         (auVar144._0_4_ * auVar144._0_4_ +
         auVar13._0_4_ * auVar13._0_4_ + auVar14._0_4_ * auVar14._0_4_) * fVar238;
    auVar26._8_4_ =
         (auVar144._8_4_ * auVar144._8_4_ +
         auVar13._8_4_ * auVar13._8_4_ + auVar14._8_4_ * auVar14._8_4_) * fVar245;
    auVar26._12_4_ =
         (auVar144._12_4_ * auVar144._12_4_ +
         auVar13._12_4_ * auVar13._12_4_ + auVar14._12_4_ * auVar14._12_4_) * fVar247;
    auVar26._16_4_ =
         (auVar144._16_4_ * auVar144._16_4_ +
         auVar13._16_4_ * auVar13._16_4_ + auVar14._16_4_ * auVar14._16_4_) * fVar253;
    auVar26._20_4_ =
         (auVar144._20_4_ * auVar144._20_4_ +
         auVar13._20_4_ * auVar13._20_4_ + auVar14._20_4_ * auVar14._20_4_) * fVar260;
    auVar26._24_4_ =
         (auVar144._24_4_ * auVar144._24_4_ +
         auVar13._24_4_ * auVar13._24_4_ + auVar14._24_4_ * auVar14._24_4_) * fVar261;
    auVar26._28_4_ = auVar144._28_4_ + auVar13._28_4_ + fVar156;
    auVar27._4_4_ =
         (auVar16._4_4_ * auVar16._4_4_ +
         auVar19._4_4_ * auVar19._4_4_ + auVar344._4_4_ * auVar344._4_4_) * fVar244;
    auVar27._0_4_ =
         (auVar16._0_4_ * auVar16._0_4_ +
         auVar19._0_4_ * auVar19._0_4_ + auVar344._0_4_ * auVar344._0_4_) * fVar238;
    auVar27._8_4_ =
         (auVar16._8_4_ * auVar16._8_4_ +
         auVar19._8_4_ * auVar19._8_4_ + auVar344._8_4_ * auVar344._8_4_) * fVar245;
    auVar27._12_4_ =
         (auVar16._12_4_ * auVar16._12_4_ +
         auVar19._12_4_ * auVar19._12_4_ + auVar344._12_4_ * auVar344._12_4_) * fVar247;
    auVar27._16_4_ =
         (auVar16._16_4_ * auVar16._16_4_ +
         auVar19._16_4_ * auVar19._16_4_ + auVar344._16_4_ * auVar344._16_4_) * fVar253;
    auVar27._20_4_ =
         (auVar16._20_4_ * auVar16._20_4_ +
         auVar19._20_4_ * auVar19._20_4_ + auVar344._20_4_ * auVar344._20_4_) * fVar260;
    auVar27._24_4_ =
         (auVar16._24_4_ * auVar16._24_4_ +
         auVar19._24_4_ * auVar19._24_4_ + auVar344._24_4_ * auVar344._24_4_) * fVar261;
    auVar27._28_4_ = auVar15._28_4_ + auVar94._28_4_;
    auVar95 = vmaxps_avx(auVar26,auVar27);
    auVar94 = vperm2f128_avx(_local_ba0,_local_ba0,1);
    auVar94 = vshufps_avx(auVar94,_local_ba0,0x30);
    auVar144 = vshufps_avx(_local_ba0,auVar94,0x29);
    auVar96._0_4_ = (float)local_ba0._0_4_ + fVar210;
    auVar96._4_4_ = (float)local_ba0._4_4_ + fVar240;
    auVar96._8_4_ = fStack_b98 + fVar322;
    auVar96._12_4_ = fStack_b94 + fVar237;
    auVar96._16_4_ = fStack_b90 + fVar176;
    auVar96._20_4_ = fStack_b8c + fVar177;
    auVar96._24_4_ = fStack_b88 + fVar211;
    auVar96._28_4_ = fStack_b84 + fVar215;
    auVar94 = vmaxps_avx(_local_ba0,auVar96);
    auVar19 = vmaxps_avx(auVar123,auVar144);
    auVar94 = vmaxps_avx(auVar94,auVar19);
    auVar19 = vrsqrtps_avx(auVar122);
    fVar156 = auVar19._0_4_;
    fVar176 = auVar19._4_4_;
    fVar210 = auVar19._8_4_;
    fVar177 = auVar19._12_4_;
    fVar240 = auVar19._16_4_;
    fVar211 = auVar19._20_4_;
    fVar322 = auVar19._24_4_;
    auVar28._4_4_ = fVar176 * fVar176 * fVar176 * auVar122._4_4_ * 0.5;
    auVar28._0_4_ = fVar156 * fVar156 * fVar156 * auVar122._0_4_ * 0.5;
    auVar28._8_4_ = fVar210 * fVar210 * fVar210 * auVar122._8_4_ * 0.5;
    auVar28._12_4_ = fVar177 * fVar177 * fVar177 * auVar122._12_4_ * 0.5;
    auVar28._16_4_ = fVar240 * fVar240 * fVar240 * auVar122._16_4_ * 0.5;
    auVar28._20_4_ = fVar211 * fVar211 * fVar211 * auVar122._20_4_ * 0.5;
    auVar28._24_4_ = fVar322 * fVar322 * fVar322 * auVar122._24_4_ * 0.5;
    auVar28._28_4_ = auVar122._28_4_;
    auVar29._4_4_ = fVar176 * 1.5;
    auVar29._0_4_ = fVar156 * 1.5;
    auVar29._8_4_ = fVar210 * 1.5;
    auVar29._12_4_ = fVar177 * 1.5;
    auVar29._16_4_ = fVar240 * 1.5;
    auVar29._20_4_ = fVar211 * 1.5;
    auVar29._24_4_ = fVar322 * 1.5;
    auVar29._28_4_ = auVar19._28_4_;
    local_540 = vsubps_avx(auVar29,auVar28);
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar65);
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar66);
    fVar176 = auVar14._0_4_;
    fVar240 = auVar14._4_4_;
    fVar215 = auVar14._8_4_;
    fVar244 = auVar14._12_4_;
    fVar253 = auVar14._16_4_;
    fVar269 = auVar14._20_4_;
    fVar301 = auVar14._24_4_;
    fVar210 = auVar13._0_4_;
    fVar211 = auVar13._4_4_;
    fVar237 = auVar13._8_4_;
    fVar245 = auVar13._12_4_;
    fVar260 = auVar13._16_4_;
    fVar271 = auVar13._20_4_;
    fVar305 = auVar13._24_4_;
    auVar62._4_4_ = fVar286;
    auVar62._0_4_ = fVar272;
    auVar62._8_4_ = fVar290;
    auVar62._12_4_ = fVar294;
    auVar62._16_4_ = fVar298;
    auVar62._20_4_ = fVar302;
    auVar62._24_4_ = fVar306;
    auVar62._28_4_ = fVar310;
    auVar278 = ZEXT832(0) << 0x20;
    auVar15 = vsubps_avx(auVar278,auVar62);
    fVar177 = auVar15._0_4_;
    fVar322 = auVar15._4_4_;
    fVar238 = auVar15._8_4_;
    fVar247 = auVar15._12_4_;
    fVar261 = auVar15._16_4_;
    fVar285 = auVar15._20_4_;
    fVar309 = auVar15._24_4_;
    auVar342._0_4_ =
         (float)local_7e0._0_4_ * fVar177 +
         (float)local_7c0._0_4_ * fVar210 + (float)local_800._0_4_ * fVar176;
    auVar342._4_4_ =
         (float)local_7e0._4_4_ * fVar322 +
         (float)local_7c0._4_4_ * fVar211 + (float)local_800._4_4_ * fVar240;
    auVar342._8_4_ = fStack_7d8 * fVar238 + fStack_7b8 * fVar237 + fStack_7f8 * fVar215;
    auVar342._12_4_ = fStack_7d4 * fVar247 + fStack_7b4 * fVar245 + fStack_7f4 * fVar244;
    auVar342._16_4_ = fStack_7d0 * fVar261 + fStack_7b0 * fVar260 + fStack_7f0 * fVar253;
    auVar342._20_4_ = fStack_7cc * fVar285 + fStack_7ac * fVar271 + fStack_7ec * fVar269;
    auVar342._24_4_ = fStack_7c8 * fVar309 + fStack_7a8 * fVar305 + fStack_7e8 * fVar301;
    auVar342._28_4_ = fVar317 + auVar344._28_4_ + auVar19._28_4_;
    auVar362._0_4_ = fVar177 * fVar177 + fVar210 * fVar210 + fVar176 * fVar176;
    auVar362._4_4_ = fVar322 * fVar322 + fVar211 * fVar211 + fVar240 * fVar240;
    auVar362._8_4_ = fVar238 * fVar238 + fVar237 * fVar237 + fVar215 * fVar215;
    auVar362._12_4_ = fVar247 * fVar247 + fVar245 * fVar245 + fVar244 * fVar244;
    auVar362._16_4_ = fVar261 * fVar261 + fVar260 * fVar260 + fVar253 * fVar253;
    auVar362._20_4_ = fVar285 * fVar285 + fVar271 * fVar271 + fVar269 * fVar269;
    auVar362._24_4_ = fVar309 * fVar309 + fVar305 * fVar305 + fVar301 * fVar301;
    auVar362._28_4_ = fStack_944 + fStack_944 + fVar317;
    fVar191 = local_540._0_4_;
    fVar207 = local_540._4_4_;
    fVar209 = local_540._8_4_;
    fVar212 = local_540._12_4_;
    fVar214 = local_540._16_4_;
    fVar216 = local_540._20_4_;
    fVar218 = local_540._24_4_;
    fVar219 = fStack_7a4 + local_600._28_4_;
    local_6a0._0_4_ =
         (float)local_7e0._0_4_ * fVar208 * fVar191 +
         fVar191 * fVar206 * (float)local_7c0._0_4_ + (float)local_800._0_4_ * fVar191 * fVar175;
    local_6a0._4_4_ =
         (float)local_7e0._4_4_ * fVar236 * fVar207 +
         fVar207 * fVar220 * (float)local_7c0._4_4_ + (float)local_800._4_4_ * fVar207 * fVar232;
    fStack_698 = fStack_7d8 * fVar213 * fVar209 +
                 fVar209 * fVar233 * fStack_7b8 + fStack_7f8 * fVar209 * fVar234;
    fStack_694 = fStack_7d4 * fVar242 * fVar212 +
                 fVar212 * fVar217 * fStack_7b4 + fStack_7f4 * fVar212 * fVar241;
    fStack_690 = fStack_7d0 * fVar251 * fVar214 +
                 fVar214 * fVar248 * fStack_7b0 + fStack_7f0 * fVar214 * fVar250;
    fStack_68c = fStack_7cc * fVar267 * fVar216 +
                 fVar216 * fVar263 * fStack_7ac + fStack_7ec * fVar216 * fVar265;
    fStack_688 = fStack_7c8 * fVar297 * fVar218 +
                 fVar218 * fVar289 * fStack_7a8 + fStack_7e8 * fVar218 * fVar293;
    fVar156 = fStack_7c4 + fVar219;
    local_a20._0_4_ =
         fVar177 * fVar208 * fVar191 + fVar191 * fVar206 * fVar210 + fVar191 * fVar175 * fVar176;
    local_a20._4_4_ =
         fVar322 * fVar236 * fVar207 + fVar207 * fVar220 * fVar211 + fVar207 * fVar232 * fVar240;
    local_a20._8_4_ =
         fVar238 * fVar213 * fVar209 + fVar209 * fVar233 * fVar237 + fVar209 * fVar234 * fVar215;
    local_a20._12_4_ =
         fVar247 * fVar242 * fVar212 + fVar212 * fVar217 * fVar245 + fVar212 * fVar241 * fVar244;
    local_a20._16_4_ =
         fVar261 * fVar251 * fVar214 + fVar214 * fVar248 * fVar260 + fVar214 * fVar250 * fVar253;
    local_a20._20_4_ =
         fVar285 * fVar267 * fVar216 + fVar216 * fVar263 * fVar271 + fVar216 * fVar265 * fVar269;
    local_a20._24_4_ =
         fVar309 * fVar297 * fVar218 + fVar218 * fVar289 * fVar305 + fVar218 * fVar293 * fVar301;
    local_a20._28_4_ = fStack_7a4 + fVar156;
    auVar30._4_4_ = (float)local_6a0._4_4_ * local_a20._4_4_;
    auVar30._0_4_ = (float)local_6a0._0_4_ * (float)local_a20._0_4_;
    auVar30._8_4_ = fStack_698 * local_a20._8_4_;
    auVar30._12_4_ = fStack_694 * local_a20._12_4_;
    auVar30._16_4_ = fStack_690 * local_a20._16_4_;
    auVar30._20_4_ = fStack_68c * local_a20._20_4_;
    auVar30._24_4_ = fStack_688 * local_a20._24_4_;
    auVar30._28_4_ = fVar156;
    auVar19 = vsubps_avx(auVar342,auVar30);
    auVar31._4_4_ = local_a20._4_4_ * local_a20._4_4_;
    auVar31._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar31._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar31._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar31._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar31._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar31._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar31._28_4_ = fStack_7a4;
    auVar16 = vsubps_avx(auVar362,auVar31);
    auStack_938 = auVar16._8_24_;
    _local_680 = vsqrtps_avx(auVar95);
    fVar156 = (local_680._0_4_ + auVar94._0_4_) * 1.0000002;
    fVar317 = (local_680._4_4_ + auVar94._4_4_) * 1.0000002;
    fVar327 = (local_680._8_4_ + auVar94._8_4_) * 1.0000002;
    fVar105 = (local_680._12_4_ + auVar94._12_4_) * 1.0000002;
    fVar106 = (local_680._16_4_ + auVar94._16_4_) * 1.0000002;
    fVar107 = (local_680._20_4_ + auVar94._20_4_) * 1.0000002;
    fVar108 = (local_680._24_4_ + auVar94._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar317 * fVar317;
    auVar32._0_4_ = fVar156 * fVar156;
    auVar32._8_4_ = fVar327 * fVar327;
    auVar32._12_4_ = fVar105 * fVar105;
    auVar32._16_4_ = fVar106 * fVar106;
    auVar32._20_4_ = fVar107 * fVar107;
    auVar32._24_4_ = fVar108 * fVar108;
    auVar32._28_4_ = local_680._28_4_ + auVar94._28_4_;
    fVar317 = auVar19._0_4_ + auVar19._0_4_;
    fVar327 = auVar19._4_4_ + auVar19._4_4_;
    local_9a0._0_8_ = CONCAT44(fVar327,fVar317);
    local_9a0._8_4_ = auVar19._8_4_ + auVar19._8_4_;
    local_9a0._12_4_ = auVar19._12_4_ + auVar19._12_4_;
    local_9a0._16_4_ = auVar19._16_4_ + auVar19._16_4_;
    local_9a0._20_4_ = auVar19._20_4_ + auVar19._20_4_;
    local_9a0._24_4_ = auVar19._24_4_ + auVar19._24_4_;
    fVar156 = auVar19._28_4_;
    local_9a0._28_4_ = fVar156 + fVar156;
    auVar19 = vsubps_avx(auVar16,auVar32);
    local_340._4_4_ = (float)local_6a0._4_4_ * (float)local_6a0._4_4_;
    local_340._0_4_ = (float)local_6a0._0_4_ * (float)local_6a0._0_4_;
    local_340._8_4_ = fStack_698 * fStack_698;
    local_340._12_4_ = fStack_694 * fStack_694;
    local_340._16_4_ = fStack_690 * fStack_690;
    local_340._20_4_ = fStack_68c * fStack_68c;
    local_340._24_4_ = fStack_688 * fStack_688;
    local_340._28_4_ = auVar16._28_4_;
    auVar326 = ZEXT3264(local_340);
    local_560 = vsubps_avx(local_2c0,local_340);
    auVar313 = ZEXT3264(local_560);
    local_5c0._4_4_ = fVar327 * fVar327;
    local_5c0._0_4_ = fVar317 * fVar317;
    local_5c0._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
    local_5c0._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
    local_5c0._16_4_ = local_9a0._16_4_ * local_9a0._16_4_;
    local_5c0._20_4_ = local_9a0._20_4_ * local_9a0._20_4_;
    local_5c0._24_4_ = local_9a0._24_4_ * local_9a0._24_4_;
    local_5c0._28_4_ = fVar156;
    fVar105 = local_560._0_4_;
    local_5e0._0_4_ = fVar105 * 4.0;
    fVar106 = local_560._4_4_;
    local_5e0._4_4_ = fVar106 * 4.0;
    fVar107 = local_560._8_4_;
    fStack_5d8 = fVar107 * 4.0;
    fVar108 = local_560._12_4_;
    fStack_5d4 = fVar108 * 4.0;
    fVar314 = local_560._16_4_;
    fStack_5d0 = fVar314 * 4.0;
    fVar315 = local_560._20_4_;
    fStack_5cc = fVar315 * 4.0;
    fVar316 = local_560._24_4_;
    fStack_5c8 = fVar316 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar33._4_4_ = auVar19._4_4_ * (float)local_5e0._4_4_;
    auVar33._0_4_ = auVar19._0_4_ * (float)local_5e0._0_4_;
    auVar33._8_4_ = auVar19._8_4_ * fStack_5d8;
    auVar33._12_4_ = auVar19._12_4_ * fStack_5d4;
    auVar33._16_4_ = auVar19._16_4_ * fStack_5d0;
    auVar33._20_4_ = auVar19._20_4_ * fStack_5cc;
    auVar33._24_4_ = auVar19._24_4_ * fStack_5c8;
    auVar33._28_4_ = 0x40800000;
    auVar344 = vsubps_avx(local_5c0,auVar33);
    auVar94 = vcmpps_avx(auVar344,auVar278,5);
    fStack_684 = fStack_7c4 + fVar219;
    fVar156 = local_560._28_4_;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar279._8_4_ = 0x7f800000;
      auVar279._0_8_ = 0x7f8000007f800000;
      auVar279._12_4_ = 0x7f800000;
      auVar279._16_4_ = 0x7f800000;
      auVar279._20_4_ = 0x7f800000;
      auVar279._24_4_ = 0x7f800000;
      auVar279._28_4_ = 0x7f800000;
      auVar363._8_4_ = 0xff800000;
      auVar363._0_8_ = 0xff800000ff800000;
      auVar363._12_4_ = 0xff800000;
      auVar363._16_4_ = 0xff800000;
      auVar363._20_4_ = 0xff800000;
      auVar363._24_4_ = 0xff800000;
      auVar363._28_4_ = 0xff800000;
    }
    else {
      auVar95 = vcmpps_avx(auVar344,auVar278,5);
      auVar278 = vsqrtps_avx(auVar344);
      auVar224._0_4_ = fVar105 + fVar105;
      auVar224._4_4_ = fVar106 + fVar106;
      auVar224._8_4_ = fVar107 + fVar107;
      auVar224._12_4_ = fVar108 + fVar108;
      auVar224._16_4_ = fVar314 + fVar314;
      auVar224._20_4_ = fVar315 + fVar315;
      auVar224._24_4_ = fVar316 + fVar316;
      auVar224._28_4_ = fVar156 + fVar156;
      auVar344 = vrcpps_avx(auVar224);
      fVar219 = auVar344._0_4_;
      fVar235 = auVar344._4_4_;
      auVar34._4_4_ = auVar224._4_4_ * fVar235;
      auVar34._0_4_ = auVar224._0_4_ * fVar219;
      fVar239 = auVar344._8_4_;
      auVar34._8_4_ = auVar224._8_4_ * fVar239;
      fVar243 = auVar344._12_4_;
      auVar34._12_4_ = auVar224._12_4_ * fVar243;
      fVar246 = auVar344._16_4_;
      auVar34._16_4_ = auVar224._16_4_ * fVar246;
      fVar249 = auVar344._20_4_;
      auVar34._20_4_ = auVar224._20_4_ * fVar249;
      fVar252 = auVar344._24_4_;
      auVar34._24_4_ = auVar224._24_4_ * fVar252;
      auVar34._28_4_ = auVar224._28_4_;
      auVar280._8_4_ = 0x3f800000;
      auVar280._0_8_ = 0x3f8000003f800000;
      auVar280._12_4_ = 0x3f800000;
      auVar280._16_4_ = 0x3f800000;
      auVar280._20_4_ = 0x3f800000;
      auVar280._24_4_ = 0x3f800000;
      auVar280._28_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar280,auVar34);
      fVar219 = fVar219 + fVar219 * auVar17._0_4_;
      fVar235 = fVar235 + fVar235 * auVar17._4_4_;
      fVar239 = fVar239 + fVar239 * auVar17._8_4_;
      fVar243 = fVar243 + fVar243 * auVar17._12_4_;
      fVar246 = fVar246 + fVar246 * auVar17._16_4_;
      fVar249 = fVar249 + fVar249 * auVar17._20_4_;
      fVar252 = fVar252 + fVar252 * auVar17._24_4_;
      auVar257._0_8_ = CONCAT44(fVar327,fVar317) ^ 0x8000000080000000;
      auVar257._8_4_ = -local_9a0._8_4_;
      auVar257._12_4_ = -local_9a0._12_4_;
      auVar257._16_4_ = -local_9a0._16_4_;
      auVar257._20_4_ = -local_9a0._20_4_;
      auVar257._24_4_ = -local_9a0._24_4_;
      auVar257._28_4_ = -local_9a0._28_4_;
      auVar18 = vsubps_avx(auVar257,auVar278);
      fVar317 = auVar18._0_4_ * fVar219;
      fVar327 = auVar18._4_4_ * fVar235;
      auVar35._4_4_ = fVar327;
      auVar35._0_4_ = fVar317;
      fVar262 = auVar18._8_4_ * fVar239;
      auVar35._8_4_ = fVar262;
      fVar264 = auVar18._12_4_ * fVar243;
      auVar35._12_4_ = fVar264;
      fVar266 = auVar18._16_4_ * fVar246;
      auVar35._16_4_ = fVar266;
      fVar268 = auVar18._20_4_ * fVar249;
      auVar35._20_4_ = fVar268;
      fVar270 = auVar18._24_4_ * fVar252;
      auVar35._24_4_ = fVar270;
      auVar35._28_4_ = auVar18._28_4_;
      auVar278 = vsubps_avx(auVar278,local_9a0);
      fVar219 = auVar278._0_4_ * fVar219;
      fVar235 = auVar278._4_4_ * fVar235;
      auVar36._4_4_ = fVar235;
      auVar36._0_4_ = fVar219;
      fVar239 = auVar278._8_4_ * fVar239;
      auVar36._8_4_ = fVar239;
      fVar243 = auVar278._12_4_ * fVar243;
      auVar36._12_4_ = fVar243;
      fVar246 = auVar278._16_4_ * fVar246;
      auVar36._16_4_ = fVar246;
      fVar249 = auVar278._20_4_ * fVar249;
      auVar36._20_4_ = fVar249;
      fVar252 = auVar278._24_4_ * fVar252;
      auVar36._24_4_ = fVar252;
      auVar36._28_4_ = auVar278._28_4_;
      local_300 = fVar191 * ((float)local_a20._0_4_ + (float)local_6a0._0_4_ * fVar317);
      fStack_2fc = fVar207 * (local_a20._4_4_ + (float)local_6a0._4_4_ * fVar327);
      fStack_2f8 = fVar209 * (local_a20._8_4_ + fStack_698 * fVar262);
      fStack_2f4 = fVar212 * (local_a20._12_4_ + fStack_694 * fVar264);
      fStack_2f0 = fVar214 * (local_a20._16_4_ + fStack_690 * fVar266);
      fStack_2ec = fVar216 * (local_a20._20_4_ + fStack_68c * fVar268);
      fStack_2e8 = fVar218 * (local_a20._24_4_ + fStack_688 * fVar270);
      fStack_2e4 = local_a20._28_4_ + auVar344._28_4_ + auVar17._28_4_;
      auVar281._8_4_ = 0x7fffffff;
      auVar281._0_8_ = 0x7fffffff7fffffff;
      auVar281._12_4_ = 0x7fffffff;
      auVar281._16_4_ = 0x7fffffff;
      auVar281._20_4_ = 0x7fffffff;
      auVar281._24_4_ = 0x7fffffff;
      auVar281._28_4_ = 0x7fffffff;
      auVar344 = vandps_avx(local_340,auVar281);
      auVar278 = vmaxps_avx(local_520,auVar344);
      auVar37._4_4_ = auVar278._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar278._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar278._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar278._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar278._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar278._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar278._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar278._28_4_;
      auVar344 = vandps_avx(local_560,auVar281);
      auVar344 = vcmpps_avx(auVar344,auVar37,1);
      auVar282._8_4_ = 0x7f800000;
      auVar282._0_8_ = 0x7f8000007f800000;
      auVar282._12_4_ = 0x7f800000;
      auVar282._16_4_ = 0x7f800000;
      auVar282._20_4_ = 0x7f800000;
      auVar282._24_4_ = 0x7f800000;
      auVar282._28_4_ = 0x7f800000;
      auVar279 = vblendvps_avx(auVar282,auVar35,auVar95);
      local_320 = fVar191 * ((float)local_a20._0_4_ + (float)local_6a0._0_4_ * fVar219);
      fStack_31c = fVar207 * (local_a20._4_4_ + (float)local_6a0._4_4_ * fVar235);
      fStack_318 = fVar209 * (local_a20._8_4_ + fStack_698 * fVar239);
      fStack_314 = fVar212 * (local_a20._12_4_ + fStack_694 * fVar243);
      fStack_310 = fVar214 * (local_a20._16_4_ + fStack_690 * fVar246);
      fStack_30c = fVar216 * (local_a20._20_4_ + fStack_68c * fVar249);
      fStack_308 = fVar218 * (local_a20._24_4_ + fStack_688 * fVar252);
      fStack_304 = local_a20._28_4_ + auVar278._28_4_;
      auVar225._8_4_ = 0xff800000;
      auVar225._0_8_ = 0xff800000ff800000;
      auVar225._12_4_ = 0xff800000;
      auVar225._16_4_ = 0xff800000;
      auVar225._20_4_ = 0xff800000;
      auVar225._24_4_ = 0xff800000;
      auVar225._28_4_ = 0xff800000;
      auVar363 = vblendvps_avx(auVar225,auVar36,auVar95);
      auVar278 = auVar95 & auVar344;
      if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar278 >> 0x7f,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar278 >> 0xbf,0) != '\0') ||
          (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar278[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar344,auVar95);
        auVar167 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar344 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,2);
        auVar346._8_4_ = 0xff800000;
        auVar346._0_8_ = 0xff800000ff800000;
        auVar346._12_4_ = 0xff800000;
        auVar346._16_4_ = 0xff800000;
        auVar346._20_4_ = 0xff800000;
        auVar346._24_4_ = 0xff800000;
        auVar346._28_4_ = 0xff800000;
        auVar371._8_4_ = 0x7f800000;
        auVar371._0_8_ = 0x7f8000007f800000;
        auVar371._12_4_ = 0x7f800000;
        auVar371._16_4_ = 0x7f800000;
        auVar371._20_4_ = 0x7f800000;
        auVar371._24_4_ = 0x7f800000;
        auVar371._28_4_ = 0x7f800000;
        auVar19 = vblendvps_avx(auVar371,auVar346,auVar344);
        auVar80 = vpmovsxwd_avx(auVar167);
        auVar167 = vpunpckhwd_avx(auVar167,auVar167);
        auVar205._16_16_ = auVar167;
        auVar205._0_16_ = auVar80;
        auVar279 = vblendvps_avx(auVar279,auVar19,auVar205);
        auVar19 = vblendvps_avx(auVar346,auVar371,auVar344);
        auVar363 = vblendvps_avx(auVar363,auVar19,auVar205);
        auVar19 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar103._0_4_ = auVar94._0_4_ ^ auVar19._0_4_;
        auVar103._4_4_ = auVar94._4_4_ ^ auVar19._4_4_;
        auVar103._8_4_ = auVar94._8_4_ ^ auVar19._8_4_;
        auVar103._12_4_ = auVar94._12_4_ ^ auVar19._12_4_;
        auVar103._16_4_ = auVar94._16_4_ ^ auVar19._16_4_;
        auVar103._20_4_ = auVar94._20_4_ ^ auVar19._20_4_;
        auVar103._24_4_ = auVar94._24_4_ ^ auVar19._24_4_;
        auVar103._28_4_ = auVar94._28_4_ ^ auVar19._28_4_;
        auVar94 = vorps_avx(auVar344,auVar103);
        auVar94 = vandps_avx(auVar95,auVar94);
      }
    }
    auVar331 = ZEXT3264(auVar95);
    auVar321 = ZEXT3264(local_a20);
    auVar259 = ZEXT3264(local_9a0);
    auVar95 = local_500 & auVar94;
    auVar231 = ZEXT3264(_local_7c0);
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar95 >> 0x7f,0) != '\0') ||
          (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar95 >> 0xbf,0) != '\0') ||
        (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar95[0x1f] < '\0')
    {
      auVar80 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar167 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_));
      auVar167 = vshufps_avx(auVar167,auVar167,0);
      auVar200._16_16_ = auVar167;
      auVar200._0_16_ = auVar167;
      auVar344 = vminps_avx(auVar200,auVar363);
      fVar249 = auVar14._28_4_;
      auVar321 = ZEXT3264(_local_800);
      auVar143._0_4_ =
           (float)local_7e0._0_4_ * fVar273 +
           (float)local_7c0._0_4_ * fVar328 + (float)local_800._0_4_ * fVar338;
      auVar143._4_4_ =
           (float)local_7e0._4_4_ * fVar287 +
           (float)local_7c0._4_4_ * fVar332 + (float)local_800._4_4_ * fVar348;
      auVar143._8_4_ = fStack_7d8 * fVar291 + fStack_7b8 * fVar333 + fStack_7f8 * fVar350;
      auVar143._12_4_ = fStack_7d4 * fVar295 + fStack_7b4 * fVar334 + fStack_7f4 * fVar352;
      auVar143._16_4_ = fStack_7d0 * fVar299 + fStack_7b0 * fVar335 + fStack_7f0 * fVar354;
      auVar143._20_4_ = fStack_7cc * fVar303 + fStack_7ac * fVar336 + fStack_7ec * fVar356;
      auVar143._24_4_ = fStack_7c8 * fVar307 + fStack_7a8 * fVar337 + fStack_7e8 * fVar358;
      auVar143._28_4_ = fVar249 + fVar249 + auVar15._28_4_;
      auVar95 = vrcpps_avx(auVar143);
      fVar317 = auVar95._0_4_;
      fVar327 = auVar95._4_4_;
      auVar38._4_4_ = auVar143._4_4_ * fVar327;
      auVar38._0_4_ = auVar143._0_4_ * fVar317;
      fVar219 = auVar95._8_4_;
      auVar38._8_4_ = auVar143._8_4_ * fVar219;
      fVar235 = auVar95._12_4_;
      auVar38._12_4_ = auVar143._12_4_ * fVar235;
      fVar239 = auVar95._16_4_;
      auVar38._16_4_ = auVar143._16_4_ * fVar239;
      fVar243 = auVar95._20_4_;
      auVar38._20_4_ = auVar143._20_4_ * fVar243;
      fVar246 = auVar95._24_4_;
      auVar38._24_4_ = auVar143._24_4_ * fVar246;
      auVar38._28_4_ = fVar318;
      auVar283._8_4_ = 0x3f800000;
      auVar283._0_8_ = 0x3f8000003f800000;
      auVar283._12_4_ = 0x3f800000;
      auVar283._16_4_ = 0x3f800000;
      auVar283._20_4_ = 0x3f800000;
      auVar283._24_4_ = 0x3f800000;
      auVar283._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar283,auVar38);
      auVar258._8_4_ = 0x7fffffff;
      auVar258._0_8_ = 0x7fffffff7fffffff;
      auVar258._12_4_ = 0x7fffffff;
      auVar258._16_4_ = 0x7fffffff;
      auVar258._20_4_ = 0x7fffffff;
      auVar258._24_4_ = 0x7fffffff;
      auVar258._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(auVar143,auVar258);
      auVar343._8_4_ = 0x219392ef;
      auVar343._0_8_ = 0x219392ef219392ef;
      auVar343._12_4_ = 0x219392ef;
      auVar343._16_4_ = 0x219392ef;
      auVar343._20_4_ = 0x219392ef;
      auVar343._24_4_ = 0x219392ef;
      auVar343._28_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar95,auVar343,1);
      auVar39._4_4_ =
           (fVar327 + fVar327 * auVar14._4_4_) *
           -(fVar287 * fVar322 + fVar332 * fVar211 + fVar348 * fVar240);
      auVar39._0_4_ =
           (fVar317 + fVar317 * auVar14._0_4_) *
           -(fVar273 * fVar177 + fVar328 * fVar210 + fVar338 * fVar176);
      auVar39._8_4_ =
           (fVar219 + fVar219 * auVar14._8_4_) *
           -(fVar291 * fVar238 + fVar333 * fVar237 + fVar350 * fVar215);
      auVar39._12_4_ =
           (fVar235 + fVar235 * auVar14._12_4_) *
           -(fVar295 * fVar247 + fVar334 * fVar245 + fVar352 * fVar244);
      auVar39._16_4_ =
           (fVar239 + fVar239 * auVar14._16_4_) *
           -(fVar299 * fVar261 + fVar335 * fVar260 + fVar354 * fVar253);
      auVar39._20_4_ =
           (fVar243 + fVar243 * auVar14._20_4_) *
           -(fVar303 * fVar285 + fVar336 * fVar271 + fVar356 * fVar269);
      auVar39._24_4_ =
           (fVar246 + fVar246 * auVar14._24_4_) *
           -(fVar307 * fVar309 + fVar337 * fVar305 + fVar358 * fVar301);
      auVar39._28_4_ = -(auVar15._28_4_ + auVar13._28_4_ + fVar249);
      auVar60 = ZEXT812(0);
      auVar95 = vcmpps_avx(auVar143,ZEXT1232(auVar60) << 0x20,1);
      auVar95 = vorps_avx(auVar19,auVar95);
      auVar312._8_4_ = 0xff800000;
      auVar312._0_8_ = 0xff800000ff800000;
      auVar312._12_4_ = 0xff800000;
      auVar312._16_4_ = 0xff800000;
      auVar312._20_4_ = 0xff800000;
      auVar312._24_4_ = 0xff800000;
      auVar312._28_4_ = 0xff800000;
      auVar313 = ZEXT3264(auVar312);
      auVar95 = vblendvps_avx(auVar39,auVar312,auVar95);
      auVar13 = vcmpps_avx(auVar143,ZEXT1232(auVar60) << 0x20,6);
      auVar19 = vorps_avx(auVar19,auVar13);
      auVar324._8_4_ = 0x7f800000;
      auVar324._0_8_ = 0x7f8000007f800000;
      auVar324._12_4_ = 0x7f800000;
      auVar324._16_4_ = 0x7f800000;
      auVar324._20_4_ = 0x7f800000;
      auVar324._24_4_ = 0x7f800000;
      auVar324._28_4_ = 0x7f800000;
      auVar326 = ZEXT3264(auVar324);
      auVar19 = vblendvps_avx(auVar39,auVar324,auVar19);
      auVar13 = vmaxps_avx(local_2e0,auVar279);
      auVar13 = vmaxps_avx(auVar13,auVar95);
      auVar14 = vminps_avx(auVar344,auVar19);
      auVar344 = ZEXT1232(auVar60) << 0x20;
      auVar95 = vsubps_avx(auVar344,auVar345);
      auVar19 = vsubps_avx(auVar344,local_a40);
      auVar40._4_4_ = auVar19._4_4_ * -fVar349;
      auVar40._0_4_ = auVar19._0_4_ * -fVar339;
      auVar40._8_4_ = auVar19._8_4_ * -fVar351;
      auVar40._12_4_ = auVar19._12_4_ * -fVar353;
      auVar40._16_4_ = auVar19._16_4_ * -fVar355;
      auVar40._20_4_ = auVar19._20_4_ * -fVar357;
      auVar40._24_4_ = auVar19._24_4_ * -fVar359;
      auVar40._28_4_ = auVar19._28_4_;
      auVar41._4_4_ = fVar365 * auVar95._4_4_;
      auVar41._0_4_ = fVar360 * auVar95._0_4_;
      auVar41._8_4_ = fVar366 * auVar95._8_4_;
      auVar41._12_4_ = fVar367 * auVar95._12_4_;
      auVar41._16_4_ = fVar368 * auVar95._16_4_;
      auVar41._20_4_ = fVar369 * auVar95._20_4_;
      auVar41._24_4_ = fVar370 * auVar95._24_4_;
      auVar41._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(auVar40,auVar41);
      auVar19 = vsubps_avx(auVar344,auVar12);
      auVar42._4_4_ = fVar288 * auVar19._4_4_;
      auVar42._0_4_ = fVar274 * auVar19._0_4_;
      auVar42._8_4_ = fVar292 * auVar19._8_4_;
      auVar42._12_4_ = fVar296 * auVar19._12_4_;
      auVar42._16_4_ = fVar300 * auVar19._16_4_;
      auVar42._20_4_ = fVar304 * auVar19._20_4_;
      uVar1 = auVar19._28_4_;
      auVar42._24_4_ = fVar308 * auVar19._24_4_;
      auVar42._28_4_ = uVar1;
      auVar345 = vsubps_avx(auVar95,auVar42);
      auVar43._4_4_ = (float)local_800._4_4_ * -fVar349;
      auVar43._0_4_ = (float)local_800._0_4_ * -fVar339;
      auVar43._8_4_ = fStack_7f8 * -fVar351;
      auVar43._12_4_ = fStack_7f4 * -fVar353;
      auVar43._16_4_ = fStack_7f0 * -fVar355;
      auVar43._20_4_ = fStack_7ec * -fVar357;
      auVar43._24_4_ = fStack_7e8 * -fVar359;
      auVar43._28_4_ = uVar73 ^ 0x80000000;
      auVar44._4_4_ = (float)local_7c0._4_4_ * fVar365;
      auVar44._0_4_ = (float)local_7c0._0_4_ * fVar360;
      auVar44._8_4_ = fStack_7b8 * fVar366;
      auVar44._12_4_ = fStack_7b4 * fVar367;
      auVar44._16_4_ = fStack_7b0 * fVar368;
      auVar44._20_4_ = fStack_7ac * fVar369;
      auVar44._24_4_ = fStack_7a8 * fVar370;
      auVar44._28_4_ = uVar1;
      auVar95 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar288 * (float)local_7e0._4_4_;
      auVar45._0_4_ = fVar274 * (float)local_7e0._0_4_;
      auVar45._8_4_ = fVar292 * fStack_7d8;
      auVar45._12_4_ = fVar296 * fStack_7d4;
      auVar45._16_4_ = fVar300 * fStack_7d0;
      auVar45._20_4_ = fVar304 * fStack_7cc;
      auVar45._24_4_ = fVar308 * fStack_7c8;
      auVar45._28_4_ = uVar1;
      auVar331 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar259 = ZEXT3264(auVar283);
      auVar12 = vsubps_avx(auVar95,auVar45);
      auVar95 = vrcpps_avx(auVar12);
      fVar176 = auVar95._0_4_;
      fVar210 = auVar95._4_4_;
      auVar46._4_4_ = auVar12._4_4_ * fVar210;
      auVar46._0_4_ = auVar12._0_4_ * fVar176;
      fVar177 = auVar95._8_4_;
      auVar46._8_4_ = auVar12._8_4_ * fVar177;
      fVar240 = auVar95._12_4_;
      auVar46._12_4_ = auVar12._12_4_ * fVar240;
      fVar211 = auVar95._16_4_;
      auVar46._16_4_ = auVar12._16_4_ * fVar211;
      fVar322 = auVar95._20_4_;
      auVar46._20_4_ = auVar12._20_4_ * fVar322;
      fVar215 = auVar95._24_4_;
      auVar46._24_4_ = auVar12._24_4_ * fVar215;
      auVar46._28_4_ = fStack_7c4;
      auVar15 = vsubps_avx(auVar283,auVar46);
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
      auVar226._16_4_ = 0x7fffffff;
      auVar226._20_4_ = 0x7fffffff;
      auVar226._24_4_ = 0x7fffffff;
      auVar226._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(auVar12,auVar226);
      auVar284._8_4_ = 0x219392ef;
      auVar284._0_8_ = 0x219392ef219392ef;
      auVar284._12_4_ = 0x219392ef;
      auVar284._16_4_ = 0x219392ef;
      auVar284._20_4_ = 0x219392ef;
      auVar284._24_4_ = 0x219392ef;
      auVar284._28_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar95,auVar284,1);
      auVar231 = ZEXT3264(auVar19);
      auVar47._4_4_ = (fVar210 + fVar210 * auVar15._4_4_) * -auVar345._4_4_;
      auVar47._0_4_ = (fVar176 + fVar176 * auVar15._0_4_) * -auVar345._0_4_;
      auVar47._8_4_ = (fVar177 + fVar177 * auVar15._8_4_) * -auVar345._8_4_;
      auVar47._12_4_ = (fVar240 + fVar240 * auVar15._12_4_) * -auVar345._12_4_;
      auVar47._16_4_ = (fVar211 + fVar211 * auVar15._16_4_) * -auVar345._16_4_;
      auVar47._20_4_ = (fVar322 + fVar322 * auVar15._20_4_) * -auVar345._20_4_;
      auVar47._24_4_ = (fVar215 + fVar215 * auVar15._24_4_) * -auVar345._24_4_;
      auVar47._28_4_ = auVar345._28_4_ ^ 0x80000000;
      auVar95 = vcmpps_avx(auVar12,auVar344,1);
      auVar95 = vorps_avx(auVar19,auVar95);
      auVar95 = vblendvps_avx(auVar47,auVar312,auVar95);
      _local_660 = vmaxps_avx(auVar13,auVar95);
      auVar345 = ZEXT1232(auVar60) << 0x20;
      auVar95 = vcmpps_avx(auVar12,auVar345,6);
      auVar95 = vorps_avx(auVar19,auVar95);
      auVar95 = vblendvps_avx(auVar47,auVar324,auVar95);
      auVar94 = vandps_avx(auVar94,local_500);
      local_360 = vminps_avx(auVar14,auVar95);
      auVar95 = vcmpps_avx(_local_660,local_360,2);
      auVar19 = auVar94 & auVar95;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar12 = _local_660;
        auVar19 = vminps_avx(_local_ba0,auVar96);
        auVar123 = vminps_avx(auVar123,auVar144);
        auVar19 = vminps_avx(auVar19,auVar123);
        auVar19 = vsubps_avx(auVar19,_local_680);
        auVar94 = vandps_avx(auVar95,auVar94);
        auVar68._4_4_ = fStack_2fc;
        auVar68._0_4_ = local_300;
        auVar68._8_4_ = fStack_2f8;
        auVar68._12_4_ = fStack_2f4;
        auVar68._16_4_ = fStack_2f0;
        auVar68._20_4_ = fStack_2ec;
        auVar68._24_4_ = fStack_2e8;
        auVar68._28_4_ = fStack_2e4;
        auVar95 = vminps_avx(auVar68,auVar283);
        auVar95 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar134 + fVar109 * (auVar95._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar153 + fVar131 * (auVar95._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar154 + fVar132 * (auVar95._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar155 + fVar133 * (auVar95._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar134 + fVar109 * (auVar95._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar153 + fVar131 * (auVar95._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar154 + fVar132 * (auVar95._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar155 + auVar95._28_4_ + 7.0;
        auVar67._4_4_ = fStack_31c;
        auVar67._0_4_ = local_320;
        auVar67._8_4_ = fStack_318;
        auVar67._12_4_ = fStack_314;
        auVar67._16_4_ = fStack_310;
        auVar67._20_4_ = fStack_30c;
        auVar67._24_4_ = fStack_308;
        auVar67._28_4_ = fStack_304;
        auVar95 = vminps_avx(auVar67,auVar283);
        auVar95 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar134 + fVar109 * (auVar95._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar153 + fVar131 * (auVar95._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar154 + fVar132 * (auVar95._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar155 + fVar133 * (auVar95._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar134 + fVar109 * (auVar95._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar153 + fVar131 * (auVar95._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar154 + fVar132 * (auVar95._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar155 + auVar95._28_4_ + 7.0;
        auVar48._4_4_ = auVar19._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar19._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar19._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar19._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar19._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar19._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar19._24_4_ * 0.99999976;
        auVar48._28_4_ = 0x3f7ffffc;
        auVar95 = vmaxps_avx(auVar345,auVar48);
        auVar49._4_4_ = auVar95._4_4_ * auVar95._4_4_;
        auVar49._0_4_ = auVar95._0_4_ * auVar95._0_4_;
        auVar49._8_4_ = auVar95._8_4_ * auVar95._8_4_;
        auVar49._12_4_ = auVar95._12_4_ * auVar95._12_4_;
        auVar49._16_4_ = auVar95._16_4_ * auVar95._16_4_;
        auVar49._20_4_ = auVar95._20_4_ * auVar95._20_4_;
        auVar49._24_4_ = auVar95._24_4_ * auVar95._24_4_;
        auVar49._28_4_ = auVar95._28_4_;
        local_920 = vsubps_avx(auVar16,auVar49);
        auVar50._4_4_ = local_920._4_4_ * (float)local_5e0._4_4_;
        auVar50._0_4_ = local_920._0_4_ * (float)local_5e0._0_4_;
        auVar50._8_4_ = local_920._8_4_ * fStack_5d8;
        auVar50._12_4_ = local_920._12_4_ * fStack_5d4;
        auVar50._16_4_ = local_920._16_4_ * fStack_5d0;
        auVar50._20_4_ = local_920._20_4_ * fStack_5cc;
        auVar50._24_4_ = local_920._24_4_ * fStack_5c8;
        auVar50._28_4_ = auVar95._28_4_;
        auVar325 = vsubps_avx(local_5c0,auVar50);
        auVar95 = vcmpps_avx(auVar325,ZEXT832(0) << 0x20,5);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0x7f,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0xbf,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar95[0x1f]) {
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_840 = ZEXT832(0) << 0x20;
          _local_860 = ZEXT832(0) << 0x20;
          auVar144 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar170 = ZEXT828(0) << 0x20;
          auVar201._8_4_ = 0x7f800000;
          auVar201._0_8_ = 0x7f8000007f800000;
          auVar201._12_4_ = 0x7f800000;
          auVar201._16_4_ = 0x7f800000;
          auVar201._20_4_ = 0x7f800000;
          auVar201._24_4_ = 0x7f800000;
          auVar201._28_4_ = 0x7f800000;
          auVar227._8_4_ = 0xff800000;
          auVar227._0_8_ = 0xff800000ff800000;
          auVar227._12_4_ = 0xff800000;
          auVar227._16_4_ = 0xff800000;
          auVar227._20_4_ = 0xff800000;
          auVar227._24_4_ = 0xff800000;
          auVar227._28_4_ = 0xff800000;
          local_920 = auVar20;
          _local_820 = _local_840;
        }
        else {
          auVar123 = vsqrtps_avx(auVar325);
          auVar145._0_4_ = fVar105 + fVar105;
          auVar145._4_4_ = fVar106 + fVar106;
          auVar145._8_4_ = fVar107 + fVar107;
          auVar145._12_4_ = fVar108 + fVar108;
          auVar145._16_4_ = fVar314 + fVar314;
          auVar145._20_4_ = fVar315 + fVar315;
          auVar145._24_4_ = fVar316 + fVar316;
          auVar145._28_4_ = fVar156 + fVar156;
          auVar19 = vrcpps_avx(auVar145);
          fVar156 = auVar19._0_4_;
          fVar176 = auVar19._4_4_;
          auVar51._4_4_ = auVar145._4_4_ * fVar176;
          auVar51._0_4_ = auVar145._0_4_ * fVar156;
          fVar210 = auVar19._8_4_;
          auVar51._8_4_ = auVar145._8_4_ * fVar210;
          fVar177 = auVar19._12_4_;
          auVar51._12_4_ = auVar145._12_4_ * fVar177;
          fVar240 = auVar19._16_4_;
          auVar51._16_4_ = auVar145._16_4_ * fVar240;
          fVar211 = auVar19._20_4_;
          auVar51._20_4_ = auVar145._20_4_ * fVar211;
          fVar322 = auVar19._24_4_;
          auVar51._24_4_ = auVar145._24_4_ * fVar322;
          auVar51._28_4_ = auVar145._28_4_;
          auVar144 = vsubps_avx(auVar283,auVar51);
          fVar156 = fVar156 + fVar156 * auVar144._0_4_;
          fVar176 = fVar176 + fVar176 * auVar144._4_4_;
          fVar210 = fVar210 + fVar210 * auVar144._8_4_;
          fVar177 = fVar177 + fVar177 * auVar144._12_4_;
          fVar240 = fVar240 + fVar240 * auVar144._16_4_;
          fVar211 = fVar211 + fVar211 * auVar144._20_4_;
          fVar322 = fVar322 + fVar322 * auVar144._24_4_;
          fVar215 = auVar19._28_4_ + auVar144._28_4_;
          auVar172._0_8_ = local_9a0._0_8_ ^ 0x8000000080000000;
          auVar172._8_4_ = -local_9a0._8_4_;
          auVar172._12_4_ = -local_9a0._12_4_;
          auVar172._16_4_ = -local_9a0._16_4_;
          auVar172._20_4_ = -local_9a0._20_4_;
          auVar172._24_4_ = -local_9a0._24_4_;
          auVar172._28_4_ = -local_9a0._28_4_;
          auVar19 = vsubps_avx(auVar172,auVar123);
          fVar261 = auVar19._0_4_ * fVar156;
          fVar269 = auVar19._4_4_ * fVar176;
          auVar52._4_4_ = fVar269;
          auVar52._0_4_ = fVar261;
          fVar271 = auVar19._8_4_ * fVar210;
          auVar52._8_4_ = fVar271;
          fVar285 = auVar19._12_4_ * fVar177;
          auVar52._12_4_ = fVar285;
          fVar301 = auVar19._16_4_ * fVar240;
          auVar52._16_4_ = fVar301;
          fVar305 = auVar19._20_4_ * fVar211;
          auVar52._20_4_ = fVar305;
          fVar309 = auVar19._24_4_ * fVar322;
          auVar52._24_4_ = fVar309;
          auVar52._28_4_ = 0x3f800000;
          auVar123 = vsubps_avx(auVar123,local_9a0);
          fVar156 = auVar123._0_4_ * fVar156;
          fVar176 = auVar123._4_4_ * fVar176;
          auVar53._4_4_ = fVar176;
          auVar53._0_4_ = fVar156;
          fVar210 = auVar123._8_4_ * fVar210;
          auVar53._8_4_ = fVar210;
          fVar177 = auVar123._12_4_ * fVar177;
          auVar53._12_4_ = fVar177;
          fVar240 = auVar123._16_4_ * fVar240;
          auVar53._16_4_ = fVar240;
          fVar211 = auVar123._20_4_ * fVar211;
          auVar53._20_4_ = fVar211;
          fVar322 = auVar123._24_4_ * fVar322;
          auVar53._24_4_ = fVar322;
          auVar53._28_4_ = 0x80000000;
          auVar331 = ZEXT3264(auVar53);
          fVar237 = (fVar261 * (float)local_6a0._0_4_ + (float)local_a20._0_4_) * fVar191;
          fVar238 = (fVar269 * (float)local_6a0._4_4_ + local_a20._4_4_) * fVar207;
          fVar244 = (fVar271 * fStack_698 + local_a20._8_4_) * fVar209;
          fVar245 = (fVar285 * fStack_694 + local_a20._12_4_) * fVar212;
          fVar247 = (fVar301 * fStack_690 + local_a20._16_4_) * fVar214;
          fVar253 = (fVar305 * fStack_68c + local_a20._20_4_) * fVar216;
          fVar260 = (fVar309 * fStack_688 + local_a20._24_4_) * fVar218;
          auVar124._0_4_ = fVar272 + fVar208 * fVar237;
          auVar124._4_4_ = fVar286 + fVar236 * fVar238;
          auVar124._8_4_ = fVar290 + fVar213 * fVar244;
          auVar124._12_4_ = fVar294 + fVar242 * fVar245;
          auVar124._16_4_ = fVar298 + fVar251 * fVar247;
          auVar124._20_4_ = fVar302 + fVar267 * fVar253;
          auVar124._24_4_ = fVar306 + fVar297 * fVar260;
          auVar124._28_4_ = fVar310 + auVar123._28_4_ + local_a20._28_4_;
          auVar54._4_4_ = (float)local_7e0._4_4_ * fVar269;
          auVar54._0_4_ = (float)local_7e0._0_4_ * fVar261;
          auVar54._8_4_ = fStack_7d8 * fVar271;
          auVar54._12_4_ = fStack_7d4 * fVar285;
          auVar54._16_4_ = fStack_7d0 * fVar301;
          auVar54._20_4_ = fStack_7cc * fVar305;
          auVar54._24_4_ = fStack_7c8 * fVar309;
          auVar54._28_4_ = fVar215;
          auVar123 = vsubps_avx(auVar54,auVar124);
          auVar146._0_4_ = local_980 + fVar206 * fVar237;
          auVar146._4_4_ = fStack_97c + fVar220 * fVar238;
          auVar146._8_4_ = fStack_978 + fVar233 * fVar244;
          auVar146._12_4_ = fStack_974 + fVar217 * fVar245;
          auVar146._16_4_ = fStack_970 + fVar248 * fVar247;
          auVar146._20_4_ = fStack_96c + fVar263 * fVar253;
          auVar146._24_4_ = fStack_968 + fVar289 * fVar260;
          auVar146._28_4_ = fStack_964 + fVar215;
          auVar202._0_4_ = (float)local_7c0._0_4_ * fVar261;
          auVar202._4_4_ = (float)local_7c0._4_4_ * fVar269;
          auVar202._8_4_ = fStack_7b8 * fVar271;
          auVar202._12_4_ = fStack_7b4 * fVar285;
          auVar202._16_4_ = fStack_7b0 * fVar301;
          auVar202._20_4_ = fStack_7ac * fVar305;
          auVar202._24_4_ = fStack_7a8 * fVar309;
          auVar202._28_4_ = 0;
          auVar144 = vsubps_avx(auVar202,auVar146);
          auVar173._0_4_ = local_960 + fVar175 * fVar237;
          auVar173._4_4_ = fStack_95c + fVar232 * fVar238;
          auVar173._8_4_ = fStack_958 + fVar234 * fVar244;
          auVar173._12_4_ = fStack_954 + fVar241 * fVar245;
          auVar173._16_4_ = fStack_950 + fVar250 * fVar247;
          auVar173._20_4_ = fStack_94c + fVar265 * fVar253;
          auVar173._24_4_ = fStack_948 + fVar293 * fVar260;
          auVar173._28_4_ = fStack_944 + auVar19._28_4_;
          auVar55._4_4_ = (float)local_800._4_4_ * fVar269;
          auVar55._0_4_ = (float)local_800._0_4_ * fVar261;
          auVar55._8_4_ = fStack_7f8 * fVar271;
          auVar55._12_4_ = fStack_7f4 * fVar285;
          auVar55._16_4_ = fStack_7f0 * fVar301;
          auVar55._20_4_ = fStack_7ec * fVar305;
          auVar55._24_4_ = fStack_7e8 * fVar309;
          auVar55._28_4_ = 0;
          auVar19 = vsubps_avx(auVar55,auVar173);
          auVar170 = auVar19._0_28_;
          fVar191 = (fVar156 * (float)local_6a0._0_4_ + (float)local_a20._0_4_) * fVar191;
          fVar207 = (fVar176 * (float)local_6a0._4_4_ + local_a20._4_4_) * fVar207;
          fVar209 = (fVar210 * fStack_698 + local_a20._8_4_) * fVar209;
          fVar212 = (fVar177 * fStack_694 + local_a20._12_4_) * fVar212;
          fVar214 = (fVar240 * fStack_690 + local_a20._16_4_) * fVar214;
          fVar216 = (fVar211 * fStack_68c + local_a20._20_4_) * fVar216;
          fVar218 = (fVar322 * fStack_688 + local_a20._24_4_) * fVar218;
          auVar228._0_4_ = fVar272 + fVar208 * fVar191;
          auVar228._4_4_ = fVar286 + fVar236 * fVar207;
          auVar228._8_4_ = fVar290 + fVar213 * fVar209;
          auVar228._12_4_ = fVar294 + fVar242 * fVar212;
          auVar228._16_4_ = fVar298 + fVar251 * fVar214;
          auVar228._20_4_ = fVar302 + fVar267 * fVar216;
          auVar228._24_4_ = fVar306 + fVar297 * fVar218;
          auVar228._28_4_ = fVar310 + fStack_624;
          auVar56._4_4_ = (float)local_7e0._4_4_ * fVar176;
          auVar56._0_4_ = (float)local_7e0._0_4_ * fVar156;
          auVar56._8_4_ = fStack_7d8 * fVar210;
          auVar56._12_4_ = fStack_7d4 * fVar177;
          auVar56._16_4_ = fStack_7d0 * fVar240;
          auVar56._20_4_ = fStack_7cc * fVar211;
          auVar56._24_4_ = fStack_7c8 * fVar322;
          auVar56._28_4_ = fStack_7c4;
          _local_820 = vsubps_avx(auVar56,auVar228);
          auVar229._0_4_ = local_980 + fVar206 * fVar191;
          auVar229._4_4_ = fStack_97c + fVar220 * fVar207;
          auVar229._8_4_ = fStack_978 + fVar233 * fVar209;
          auVar229._12_4_ = fStack_974 + fVar217 * fVar212;
          auVar229._16_4_ = fStack_970 + fVar248 * fVar214;
          auVar229._20_4_ = fStack_96c + fVar263 * fVar216;
          auVar229._24_4_ = fStack_968 + fVar289 * fVar218;
          auVar229._28_4_ = fStack_964 + local_820._28_4_;
          auVar57._4_4_ = (float)local_7c0._4_4_ * fVar176;
          auVar57._0_4_ = (float)local_7c0._0_4_ * fVar156;
          auVar57._8_4_ = fStack_7b8 * fVar210;
          auVar57._12_4_ = fStack_7b4 * fVar177;
          auVar57._16_4_ = fStack_7b0 * fVar240;
          auVar57._20_4_ = fStack_7ac * fVar211;
          auVar57._24_4_ = fStack_7a8 * fVar322;
          auVar57._28_4_ = fStack_7c4;
          _local_840 = vsubps_avx(auVar57,auVar229);
          auVar203._0_4_ = local_960 + fVar175 * fVar191;
          auVar203._4_4_ = fStack_95c + fVar232 * fVar207;
          auVar203._8_4_ = fStack_958 + fVar234 * fVar209;
          auVar203._12_4_ = fStack_954 + fVar241 * fVar212;
          auVar203._16_4_ = fStack_950 + fVar250 * fVar214;
          auVar203._20_4_ = fStack_94c + fVar265 * fVar216;
          auVar203._24_4_ = fStack_948 + fVar293 * fVar218;
          auVar203._28_4_ = fStack_944 + local_a20._28_4_ + 0.0;
          auVar58._4_4_ = (float)local_800._4_4_ * fVar176;
          auVar58._0_4_ = (float)local_800._0_4_ * fVar156;
          auVar58._8_4_ = fStack_7f8 * fVar210;
          auVar58._12_4_ = fStack_7f4 * fVar177;
          auVar58._16_4_ = fStack_7f0 * fVar240;
          auVar58._20_4_ = fStack_7ec * fVar211;
          auVar58._24_4_ = fStack_7e8 * fVar322;
          auVar58._28_4_ = local_840._28_4_;
          _local_860 = vsubps_avx(auVar58,auVar203);
          auVar345 = vcmpps_avx(auVar325,auVar345,5);
          auVar204._8_4_ = 0x7f800000;
          auVar204._0_8_ = 0x7f8000007f800000;
          auVar204._12_4_ = 0x7f800000;
          auVar204._16_4_ = 0x7f800000;
          auVar204._20_4_ = 0x7f800000;
          auVar204._24_4_ = 0x7f800000;
          auVar204._28_4_ = 0x7f800000;
          auVar201 = vblendvps_avx(auVar204,auVar52,auVar345);
          auVar319._8_4_ = 0x7fffffff;
          auVar319._0_8_ = 0x7fffffff7fffffff;
          auVar319._12_4_ = 0x7fffffff;
          auVar319._16_4_ = 0x7fffffff;
          auVar319._20_4_ = 0x7fffffff;
          auVar319._24_4_ = 0x7fffffff;
          auVar319._28_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar319,local_340);
          auVar19 = vmaxps_avx(local_520,auVar19);
          auVar325._8_4_ = 0x36000000;
          auVar325._0_8_ = 0x3600000036000000;
          auVar325._12_4_ = 0x36000000;
          auVar325._16_4_ = 0x36000000;
          auVar325._20_4_ = 0x36000000;
          auVar325._24_4_ = 0x36000000;
          auVar325._28_4_ = 0x36000000;
          auVar59._4_4_ = auVar19._4_4_ * 1.9073486e-06;
          auVar59._0_4_ = auVar19._0_4_ * 1.9073486e-06;
          auVar59._8_4_ = auVar19._8_4_ * 1.9073486e-06;
          auVar59._12_4_ = auVar19._12_4_ * 1.9073486e-06;
          auVar59._16_4_ = auVar19._16_4_ * 1.9073486e-06;
          auVar59._20_4_ = auVar19._20_4_ * 1.9073486e-06;
          auVar59._24_4_ = auVar19._24_4_ * 1.9073486e-06;
          auVar59._28_4_ = auVar19._28_4_;
          auVar19 = vandps_avx(auVar319,local_560);
          auVar19 = vcmpps_avx(auVar19,auVar59,1);
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar227 = vblendvps_avx(auVar230,auVar53,auVar345);
          auVar13 = auVar345 & auVar19;
          local_a40 = auVar144;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar95 = vandps_avx(auVar19,auVar345);
            auVar167 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
            auVar13 = vcmpps_avx(local_920,ZEXT832(0) << 0x20,2);
            auVar364._8_4_ = 0xff800000;
            auVar364._0_8_ = 0xff800000ff800000;
            auVar364._12_4_ = 0xff800000;
            auVar364._16_4_ = 0xff800000;
            auVar364._20_4_ = 0xff800000;
            auVar364._24_4_ = 0xff800000;
            auVar364._28_4_ = 0xff800000;
            auVar347._8_4_ = 0x7f800000;
            auVar347._0_8_ = 0x7f8000007f800000;
            auVar347._12_4_ = 0x7f800000;
            auVar347._16_4_ = 0x7f800000;
            auVar347._20_4_ = 0x7f800000;
            auVar347._24_4_ = 0x7f800000;
            auVar347._28_4_ = 0x7f800000;
            auVar19 = vblendvps_avx(auVar347,auVar364,auVar13);
            auVar88 = vpmovsxwd_avx(auVar167);
            auVar331 = ZEXT1664(auVar88);
            auVar167 = vpunpckhwd_avx(auVar167,auVar167);
            auVar320._16_16_ = auVar167;
            auVar320._0_16_ = auVar88;
            auVar201 = vblendvps_avx(auVar201,auVar19,auVar320);
            auVar325 = vblendvps_avx(auVar364,auVar347,auVar13);
            auVar227 = vblendvps_avx(auVar227,auVar325,auVar320);
            auVar19 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar104._0_4_ = auVar19._0_4_ ^ auVar95._0_4_;
            auVar104._4_4_ = auVar19._4_4_ ^ auVar95._4_4_;
            auVar104._8_4_ = auVar19._8_4_ ^ auVar95._8_4_;
            auVar104._12_4_ = auVar19._12_4_ ^ auVar95._12_4_;
            auVar104._16_4_ = auVar19._16_4_ ^ auVar95._16_4_;
            auVar104._20_4_ = auVar19._20_4_ ^ auVar95._20_4_;
            auVar104._24_4_ = auVar19._24_4_ ^ auVar95._24_4_;
            auVar104._28_4_ = auVar19._28_4_ ^ auVar95._28_4_;
            auVar95 = vorps_avx(auVar13,auVar104);
            auVar95 = vandps_avx(auVar345,auVar95);
          }
        }
        auVar326 = ZEXT3264(auVar325);
        auVar321 = ZEXT3264(auVar94);
        auVar313 = ZEXT1664(auVar80);
        _local_3c0 = _local_660;
        local_3a0 = vminps_avx(local_360,auVar201);
        local_380 = vmaxps_avx(_local_660,auVar227);
        auVar231 = ZEXT3264(local_380);
        auVar19 = vcmpps_avx(_local_660,local_3a0,2);
        local_5c0 = vandps_avx(auVar94,auVar19);
        auVar19 = vcmpps_avx(local_380,local_360,2);
        _local_6a0 = vandps_avx(auVar94,auVar19);
        auVar259 = ZEXT3264(_local_6a0);
        auVar94 = vorps_avx(_local_6a0,local_5c0);
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0x7f,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0xbf,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar94[0x1f] < '\0') {
          _local_680 = local_380;
          auVar19 = _local_680;
          local_880 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_600._0_4_ = auVar95._0_4_ ^ local_880._0_4_;
          local_600._4_4_ = auVar95._4_4_ ^ local_880._4_4_;
          local_600._8_4_ = auVar95._8_4_ ^ local_880._8_4_;
          local_600._12_4_ = auVar95._12_4_ ^ local_880._12_4_;
          local_600._16_4_ = auVar95._16_4_ ^ local_880._16_4_;
          local_600._20_4_ = auVar95._20_4_ ^ local_880._20_4_;
          local_600._24_4_ = auVar95._24_4_ ^ local_880._24_4_;
          local_600._28_4_ = (uint)auVar95._28_4_ ^ local_880._28_4_;
          auVar97._0_4_ =
               (float)local_7e0._0_4_ * auVar123._0_4_ +
               (float)local_7c0._0_4_ * auVar144._0_4_ + (float)local_800._0_4_ * auVar170._0_4_;
          auVar97._4_4_ =
               (float)local_7e0._4_4_ * auVar123._4_4_ +
               (float)local_7c0._4_4_ * auVar144._4_4_ + (float)local_800._4_4_ * auVar170._4_4_;
          auVar97._8_4_ =
               fStack_7d8 * auVar123._8_4_ +
               fStack_7b8 * auVar144._8_4_ + fStack_7f8 * auVar170._8_4_;
          auVar97._12_4_ =
               fStack_7d4 * auVar123._12_4_ +
               fStack_7b4 * auVar144._12_4_ + fStack_7f4 * auVar170._12_4_;
          auVar97._16_4_ =
               fStack_7d0 * auVar123._16_4_ +
               fStack_7b0 * auVar144._16_4_ + fStack_7f0 * auVar170._16_4_;
          auVar97._20_4_ =
               fStack_7cc * auVar123._20_4_ +
               fStack_7ac * auVar144._20_4_ + fStack_7ec * auVar170._20_4_;
          auVar97._24_4_ =
               fStack_7c8 * auVar123._24_4_ +
               fStack_7a8 * auVar144._24_4_ + fStack_7e8 * auVar170._24_4_;
          auVar97._28_4_ = auVar95._28_4_ + auVar123._28_4_ + auVar144._28_4_;
          auVar125._8_4_ = 0x7fffffff;
          auVar125._0_8_ = 0x7fffffff7fffffff;
          auVar125._12_4_ = 0x7fffffff;
          auVar125._16_4_ = 0x7fffffff;
          auVar125._20_4_ = 0x7fffffff;
          auVar125._24_4_ = 0x7fffffff;
          auVar125._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar97,auVar125);
          auVar126._8_4_ = 0x3e99999a;
          auVar126._0_8_ = 0x3e99999a3e99999a;
          auVar126._12_4_ = 0x3e99999a;
          auVar126._16_4_ = 0x3e99999a;
          auVar126._20_4_ = 0x3e99999a;
          auVar126._24_4_ = 0x3e99999a;
          auVar126._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar126,1);
          auVar94 = vorps_avx(local_600,auVar94);
          auVar127._8_4_ = 3;
          auVar127._0_8_ = 0x300000003;
          auVar127._12_4_ = 3;
          auVar127._16_4_ = 3;
          auVar127._20_4_ = 3;
          auVar127._24_4_ = 3;
          auVar127._28_4_ = 3;
          auVar147._8_4_ = 2;
          auVar147._0_8_ = 0x200000002;
          auVar147._12_4_ = 2;
          auVar147._16_4_ = 2;
          auVar147._20_4_ = 2;
          auVar147._24_4_ = 2;
          auVar147._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar147,auVar127,auVar94);
          local_620 = ZEXT432(local_be8);
          auVar88 = vpshufd_avx(ZEXT416(local_be8),0);
          fVar156 = 0.0;
          auVar167 = vpcmpgtd_avx(auVar94._16_16_,auVar88);
          local_640._0_16_ = auVar88;
          auVar88 = vpcmpgtd_avx(auVar94._0_16_,auVar88);
          auVar128._16_16_ = auVar167;
          auVar128._0_16_ = auVar88;
          _local_5e0 = vblendps_avx(ZEXT1632(auVar88),auVar128,0xf0);
          local_5a0 = vandnps_avx(_local_5e0,local_5c0);
          auVar259 = ZEXT3264(local_5a0);
          auVar94 = local_5c0 & ~_local_5e0;
          local_ac0 = auVar10._0_4_;
          fStack_abc = auVar10._4_4_;
          fStack_ab8 = auVar10._8_4_;
          fStack_ab4 = auVar10._12_4_;
          local_aa0 = auVar9._0_4_;
          fStack_a9c = auVar9._4_4_;
          fStack_a98 = auVar9._8_4_;
          fStack_a94 = auVar9._12_4_;
          local_ab0 = auVar81._0_4_;
          fStack_aac = auVar81._4_4_;
          fStack_aa8 = auVar81._8_4_;
          fStack_aa4 = auVar81._12_4_;
          local_a90 = auVar11._0_4_;
          fStack_a8c = auVar11._4_4_;
          fStack_a88 = auVar11._8_4_;
          fStack_a84 = auVar11._12_4_;
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0x7f,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0xbf,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar94[0x1f]) {
            auVar167 = vshufps_avx(auVar80,auVar80,0);
            auVar98._16_16_ = auVar167;
            auVar98._0_16_ = auVar167;
            local_680._0_4_ = local_380._0_4_;
            local_680._4_4_ = local_380._4_4_;
            fStack_678 = local_380._8_4_;
            fStack_674 = local_380._12_4_;
            fStack_670 = local_380._16_4_;
            fStack_66c = local_380._20_4_;
            fStack_668 = local_380._24_4_;
            fStack_664 = local_380._28_4_;
            fVar206 = (float)local_680._0_4_;
            fVar175 = (float)local_680._4_4_;
            fVar208 = fStack_678;
            fVar176 = fStack_674;
            fVar210 = fStack_670;
            fVar177 = fStack_66c;
            fVar220 = fStack_668;
            fVar232 = fStack_664;
            _local_680 = auVar19;
          }
          else {
            local_9c0._4_4_ = (float)local_660._4_4_ + (float)local_900._4_4_;
            local_9c0._0_4_ = (float)local_660._0_4_ + (float)local_900._0_4_;
            fStack_9b8 = fStack_658 + fStack_8f8;
            fStack_9b4 = fStack_654 + fStack_8f4;
            fStack_9b0 = fStack_650 + fStack_8f0;
            fStack_9ac = fStack_64c + fStack_8ec;
            fStack_9a8 = fStack_648 + fStack_8e8;
            fStack_9a4 = fStack_644 + fStack_8e4;
            _local_660 = auVar12;
            do {
              auVar99._8_4_ = 0x7f800000;
              auVar99._0_8_ = 0x7f8000007f800000;
              auVar99._12_4_ = 0x7f800000;
              auVar99._16_4_ = 0x7f800000;
              auVar99._20_4_ = 0x7f800000;
              auVar99._24_4_ = 0x7f800000;
              auVar99._28_4_ = 0x7f800000;
              auVar94 = auVar259._0_32_;
              auVar95 = vblendvps_avx(auVar99,_local_660,auVar94);
              auVar19 = vshufps_avx(auVar95,auVar95,0xb1);
              auVar19 = vminps_avx(auVar95,auVar19);
              auVar345 = vshufpd_avx(auVar19,auVar19,5);
              auVar19 = vminps_avx(auVar19,auVar345);
              auVar345 = vperm2f128_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar19,auVar345);
              auVar95 = vcmpps_avx(auVar95,auVar19,0);
              auVar19 = auVar94 & auVar95;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar94 = vandps_avx(auVar95,auVar94);
              }
              uVar70 = vmovmskps_avx(auVar94);
              uVar73 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
                }
              }
              uVar71 = (ulong)uVar73;
              *(undefined4 *)(local_5a0 + uVar71 * 4) = 0;
              fVar156 = local_1a0[uVar71];
              uVar73 = *(uint *)(local_3c0 + uVar71 * 4);
              fVar206 = auVar111._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                fVar206 = sqrtf((float)local_9e0._0_4_);
              }
              auVar80 = vminps_avx(auVar11,auVar81);
              auVar167 = vmaxps_avx(auVar11,auVar81);
              auVar88 = vminps_avx(auVar9,auVar10);
              auVar79 = vminps_avx(auVar80,auVar88);
              auVar80 = vmaxps_avx(auVar9,auVar10);
              auVar88 = vmaxps_avx(auVar167,auVar80);
              auVar159._8_4_ = 0x7fffffff;
              auVar159._0_8_ = 0x7fffffff7fffffff;
              auVar159._12_4_ = 0x7fffffff;
              auVar167 = vandps_avx(auVar79,auVar159);
              auVar80 = vandps_avx(auVar88,auVar159);
              auVar167 = vmaxps_avx(auVar167,auVar80);
              auVar80 = vmovshdup_avx(auVar167);
              auVar80 = vmaxss_avx(auVar80,auVar167);
              auVar167 = vshufpd_avx(auVar167,auVar167,1);
              auVar167 = vmaxss_avx(auVar167,auVar80);
              local_960 = auVar167._0_4_ * 1.9073486e-06;
              local_920._0_4_ = fVar206 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar88,auVar88,0xff);
              auVar167 = vinsertps_avx(ZEXT416(uVar73),ZEXT416((uint)fVar156),0x10);
              auVar313 = ZEXT1664(auVar167);
              lVar75 = 5;
              do {
                auVar110 = auVar313._0_16_;
                auVar167 = vmovshdup_avx(auVar110);
                fVar156 = auVar167._0_4_;
                fVar176 = 1.0 - fVar156;
                fVar206 = fVar176 * fVar176 * fVar176;
                fVar175 = fVar156 * fVar156 * fVar156;
                fVar208 = fVar156 * fVar176;
                auVar167 = vshufps_avx(ZEXT416((uint)(fVar175 * 0.16666667)),
                                       ZEXT416((uint)(fVar175 * 0.16666667)),0);
                auVar80 = ZEXT416((uint)((fVar175 * 4.0 + fVar206 +
                                         fVar156 * fVar208 * 12.0 + fVar176 * fVar208 * 6.0) *
                                        0.16666667));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar88 = ZEXT416((uint)((fVar206 * 4.0 + fVar175 +
                                         fVar176 * fVar208 * 12.0 + fVar156 * fVar208 * 6.0) *
                                        0.16666667));
                auVar88 = vshufps_avx(auVar88,auVar88,0);
                auVar79 = vshufps_avx(auVar110,auVar110,0);
                auVar137._0_4_ = auVar79._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar137._4_4_ = auVar79._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar137._8_4_ = auVar79._8_4_ * fStack_9c8 + 0.0;
                auVar137._12_4_ = auVar79._12_4_ * fStack_9c4 + 0.0;
                auVar79 = vshufps_avx(ZEXT416((uint)(fVar206 * 0.16666667)),
                                      ZEXT416((uint)(fVar206 * 0.16666667)),0);
                auVar83._0_4_ =
                     auVar79._0_4_ * local_a90 +
                     auVar88._0_4_ * local_ab0 +
                     auVar167._0_4_ * local_ac0 + auVar80._0_4_ * local_aa0;
                auVar83._4_4_ =
                     auVar79._4_4_ * fStack_a8c +
                     auVar88._4_4_ * fStack_aac +
                     auVar167._4_4_ * fStack_abc + auVar80._4_4_ * fStack_a9c;
                auVar83._8_4_ =
                     auVar79._8_4_ * fStack_a88 +
                     auVar88._8_4_ * fStack_aa8 +
                     auVar167._8_4_ * fStack_ab8 + auVar80._8_4_ * fStack_a98;
                auVar83._12_4_ =
                     auVar79._12_4_ * fStack_a84 +
                     auVar88._12_4_ * fStack_aa4 +
                     auVar167._12_4_ * fStack_ab4 + auVar80._12_4_ * fStack_a94;
                local_a40._0_16_ = auVar83;
                auVar167 = vsubps_avx(auVar137,auVar83);
                local_980 = auVar167._0_4_;
                fStack_97c = auVar167._4_4_;
                fStack_978 = auVar167._8_4_;
                fStack_974 = auVar167._12_4_;
                auVar167 = vdpps_avx(auVar167,auVar167,0x7f);
                fVar206 = auVar167._0_4_;
                local_be0 = auVar313._0_4_;
                if (fVar206 < 0.0) {
                  fVar175 = sqrtf(fVar206);
                }
                else {
                  auVar80 = vsqrtss_avx(auVar167,auVar167);
                  fVar175 = auVar80._0_4_;
                }
                auVar80 = ZEXT416((uint)(fVar156 * fVar156 * 0.5));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar88 = ZEXT416((uint)((fVar176 * fVar176 + fVar208 * 4.0) * 0.5));
                auVar88 = vshufps_avx(auVar88,auVar88,0);
                auVar79 = ZEXT416((uint)((fVar156 * -fVar156 - fVar208 * 4.0) * 0.5));
                auVar79 = vshufps_avx(auVar79,auVar79,0);
                auVar87 = ZEXT416((uint)(fVar176 * -fVar176 * 0.5));
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                auVar276._0_4_ =
                     local_a90 * auVar87._0_4_ +
                     local_ab0 * auVar79._0_4_ +
                     local_ac0 * auVar80._0_4_ + local_aa0 * auVar88._0_4_;
                auVar276._4_4_ =
                     fStack_a8c * auVar87._4_4_ +
                     fStack_aac * auVar79._4_4_ +
                     fStack_abc * auVar80._4_4_ + fStack_a9c * auVar88._4_4_;
                auVar276._8_4_ =
                     fStack_a88 * auVar87._8_4_ +
                     fStack_aa8 * auVar79._8_4_ +
                     fStack_ab8 * auVar80._8_4_ + fStack_a98 * auVar88._8_4_;
                auVar276._12_4_ =
                     fStack_a84 * auVar87._12_4_ +
                     fStack_aa4 * auVar79._12_4_ +
                     fStack_ab4 * auVar80._12_4_ + fStack_a94 * auVar88._12_4_;
                auVar80 = vshufps_avx(auVar110,auVar110,0x55);
                auVar88 = ZEXT416((uint)(fVar176 - (fVar156 + fVar156)));
                auVar79 = vshufps_avx(auVar88,auVar88,0);
                auVar88 = ZEXT416((uint)(fVar156 - (fVar176 + fVar176)));
                auVar87 = vshufps_avx(auVar88,auVar88,0);
                auVar135 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
                auVar88 = vdpps_avx(auVar276,auVar276,0x7f);
                auVar112._0_4_ =
                     local_a90 * auVar135._0_4_ +
                     local_ab0 * auVar87._0_4_ +
                     local_ac0 * auVar80._0_4_ + local_aa0 * auVar79._0_4_;
                auVar112._4_4_ =
                     fStack_a8c * auVar135._4_4_ +
                     fStack_aac * auVar87._4_4_ +
                     fStack_abc * auVar80._4_4_ + fStack_a9c * auVar79._4_4_;
                auVar112._8_4_ =
                     fStack_a88 * auVar135._8_4_ +
                     fStack_aa8 * auVar87._8_4_ +
                     fStack_ab8 * auVar80._8_4_ + fStack_a98 * auVar79._8_4_;
                auVar112._12_4_ =
                     fStack_a84 * auVar135._12_4_ +
                     fStack_aa4 * auVar87._12_4_ +
                     fStack_ab4 * auVar80._12_4_ + fStack_a94 * auVar79._12_4_;
                auVar80 = vblendps_avx(auVar88,_DAT_01f7aa10,0xe);
                auVar79 = vrsqrtss_avx(auVar80,auVar80);
                fVar208 = auVar79._0_4_;
                fVar156 = auVar88._0_4_;
                auVar79 = vdpps_avx(auVar276,auVar112,0x7f);
                auVar87 = vshufps_avx(auVar88,auVar88,0);
                auVar113._0_4_ = auVar112._0_4_ * auVar87._0_4_;
                auVar113._4_4_ = auVar112._4_4_ * auVar87._4_4_;
                auVar113._8_4_ = auVar112._8_4_ * auVar87._8_4_;
                auVar113._12_4_ = auVar112._12_4_ * auVar87._12_4_;
                auVar79 = vshufps_avx(auVar79,auVar79,0);
                auVar180._0_4_ = auVar276._0_4_ * auVar79._0_4_;
                auVar180._4_4_ = auVar276._4_4_ * auVar79._4_4_;
                auVar180._8_4_ = auVar276._8_4_ * auVar79._8_4_;
                auVar180._12_4_ = auVar276._12_4_ * auVar79._12_4_;
                auVar135 = vsubps_avx(auVar113,auVar180);
                auVar79 = vrcpss_avx(auVar80,auVar80);
                auVar80 = vmaxss_avx(ZEXT416((uint)local_960),
                                     ZEXT416((uint)(local_be0 * (float)local_920._0_4_)));
                auVar321 = ZEXT1664(auVar80);
                auVar79 = ZEXT416((uint)(auVar79._0_4_ * (2.0 - fVar156 * auVar79._0_4_)));
                auVar79 = vshufps_avx(auVar79,auVar79,0);
                uVar71 = CONCAT44(auVar276._4_4_,auVar276._0_4_);
                auVar195._0_8_ = uVar71 ^ 0x8000000080000000;
                auVar195._8_4_ = -auVar276._8_4_;
                auVar195._12_4_ = -auVar276._12_4_;
                auVar87 = ZEXT416((uint)(fVar208 * 1.5 +
                                        fVar156 * -0.5 * fVar208 * fVar208 * fVar208));
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                auVar160._0_4_ = auVar87._0_4_ * auVar135._0_4_ * auVar79._0_4_;
                auVar160._4_4_ = auVar87._4_4_ * auVar135._4_4_ * auVar79._4_4_;
                auVar160._8_4_ = auVar87._8_4_ * auVar135._8_4_ * auVar79._8_4_;
                auVar160._12_4_ = auVar87._12_4_ * auVar135._12_4_ * auVar79._12_4_;
                auVar222._0_4_ = auVar276._0_4_ * auVar87._0_4_;
                auVar222._4_4_ = auVar276._4_4_ * auVar87._4_4_;
                auVar222._8_4_ = auVar276._8_4_ * auVar87._8_4_;
                auVar222._12_4_ = auVar276._12_4_ * auVar87._12_4_;
                if (fVar156 < 0.0) {
                  local_a00._0_16_ = auVar160;
                  fVar156 = sqrtf(fVar156);
                  auVar321 = ZEXT464(auVar80._0_4_);
                  auVar160 = local_a00._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar156 = auVar88._0_4_;
                }
                auVar63._4_4_ = fStack_97c;
                auVar63._0_4_ = local_980;
                auVar63._8_4_ = fStack_978;
                auVar63._12_4_ = fStack_974;
                auVar88 = vdpps_avx(auVar63,auVar222,0x7f);
                fVar156 = (local_960 / fVar156) * (fVar175 + 1.0) +
                          auVar321._0_4_ + fVar175 * local_960;
                auVar79 = vdpps_avx(auVar195,auVar222,0x7f);
                auVar87 = vdpps_avx(auVar63,auVar160,0x7f);
                auVar135 = vdpps_avx(_local_9d0,auVar222,0x7f);
                auVar136 = vdpps_avx(auVar63,auVar195,0x7f);
                fVar175 = auVar79._0_4_ + auVar87._0_4_;
                fVar208 = auVar88._0_4_;
                auVar84._0_4_ = fVar208 * fVar208;
                auVar84._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar84._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar84._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar87 = vsubps_avx(auVar167,auVar84);
                auVar79 = vdpps_avx(auVar63,_local_9d0,0x7f);
                fVar176 = auVar136._0_4_ - fVar208 * fVar175;
                fVar210 = auVar79._0_4_ - fVar208 * auVar135._0_4_;
                auVar79 = vrsqrtss_avx(auVar87,auVar87);
                fVar177 = auVar87._0_4_;
                fVar208 = auVar79._0_4_;
                fVar208 = fVar208 * 1.5 + fVar177 * -0.5 * fVar208 * fVar208 * fVar208;
                if (fVar177 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar175);
                  local_780._0_4_ = fVar176;
                  local_a20._0_4_ = fVar210;
                  local_9a0._0_4_ = fVar208;
                  fVar177 = sqrtf(fVar177);
                  auVar321 = ZEXT464(auVar80._0_4_);
                  fVar208 = (float)local_9a0._0_4_;
                  fVar176 = (float)local_780._0_4_;
                  fVar210 = (float)local_a20._0_4_;
                  auVar80 = local_a00._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar87,auVar87);
                  fVar177 = auVar80._0_4_;
                  auVar80 = ZEXT416((uint)fVar175);
                }
                auVar331 = ZEXT1664(auVar88);
                auVar326 = ZEXT464((uint)fVar156);
                auVar90 = vpermilps_avx(local_a40._0_16_,0xff);
                auVar136 = vshufps_avx(auVar276,auVar276,0xff);
                fVar175 = fVar176 * fVar208 - auVar136._0_4_;
                auVar181._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                auVar181._8_4_ = auVar135._8_4_ ^ 0x80000000;
                auVar181._12_4_ = auVar135._12_4_ ^ 0x80000000;
                auVar196._0_4_ = -fVar175;
                auVar196._4_4_ = 0x80000000;
                auVar196._8_4_ = 0x80000000;
                auVar196._12_4_ = 0x80000000;
                auVar79 = vinsertps_avx(auVar196,ZEXT416((uint)(fVar210 * fVar208)),0x1c);
                auVar87 = vmovsldup_avx(ZEXT416((uint)(auVar80._0_4_ * fVar210 * fVar208 -
                                                      auVar135._0_4_ * fVar175)));
                auVar79 = vdivps_avx(auVar79,auVar87);
                auVar80 = vinsertps_avx(auVar80,auVar181,0x10);
                auVar80 = vdivps_avx(auVar80,auVar87);
                auVar87 = vmovsldup_avx(auVar88);
                auVar90 = ZEXT416((uint)(fVar177 - auVar90._0_4_));
                auVar135 = vmovsldup_avx(auVar90);
                auVar138._0_4_ = auVar87._0_4_ * auVar79._0_4_ + auVar135._0_4_ * auVar80._0_4_;
                auVar138._4_4_ = auVar87._4_4_ * auVar79._4_4_ + auVar135._4_4_ * auVar80._4_4_;
                auVar138._8_4_ = auVar87._8_4_ * auVar79._8_4_ + auVar135._8_4_ * auVar80._8_4_;
                auVar138._12_4_ = auVar87._12_4_ * auVar79._12_4_ + auVar135._12_4_ * auVar80._12_4_
                ;
                auVar79 = vsubps_avx(auVar110,auVar138);
                auVar313 = ZEXT1664(auVar79);
                auVar139._8_4_ = 0x7fffffff;
                auVar139._0_8_ = 0x7fffffff7fffffff;
                auVar139._12_4_ = 0x7fffffff;
                auVar80 = vandps_avx(auVar88,auVar139);
                if (auVar80._0_4_ < fVar156) {
                  auVar161._8_4_ = 0x7fffffff;
                  auVar161._0_8_ = 0x7fffffff7fffffff;
                  auVar161._12_4_ = 0x7fffffff;
                  auVar80 = vandps_avx(auVar90,auVar161);
                  if (auVar80._0_4_ <
                      (float)local_7a0._0_4_ * 1.9073486e-06 + auVar321._0_4_ + fVar156) {
                    fVar175 = auVar79._0_4_ + (float)local_8b0._0_4_;
                    if ((fVar190 <= fVar175) &&
                       (fVar208 = *(float *)(ray + k * 4 + 0x80), fVar175 <= fVar208)) {
                      auVar80 = vmovshdup_avx(auVar79);
                      fVar176 = auVar80._0_4_;
                      if ((0.0 <= fVar176) && (fVar176 <= 1.0)) {
                        auVar167 = vrsqrtss_avx(auVar167,auVar167);
                        fVar210 = auVar167._0_4_;
                        pGVar4 = (context->scene->geometries).items[uVar69].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar167 = ZEXT416((uint)(fVar210 * 1.5 +
                                                   fVar206 * -0.5 * fVar210 * fVar210 * fVar210));
                          auVar167 = vshufps_avx(auVar167,auVar167,0);
                          auVar162._0_4_ = auVar167._0_4_ * local_980;
                          auVar162._4_4_ = auVar167._4_4_ * fStack_97c;
                          auVar162._8_4_ = auVar167._8_4_ * fStack_978;
                          auVar162._12_4_ = auVar167._12_4_ * fStack_974;
                          auVar114._0_4_ = auVar276._0_4_ + auVar136._0_4_ * auVar162._0_4_;
                          auVar114._4_4_ = auVar276._4_4_ + auVar136._4_4_ * auVar162._4_4_;
                          auVar114._8_4_ = auVar276._8_4_ + auVar136._8_4_ * auVar162._8_4_;
                          auVar114._12_4_ = auVar276._12_4_ + auVar136._12_4_ * auVar162._12_4_;
                          auVar167 = vshufps_avx(auVar162,auVar162,0xc9);
                          auVar80 = vshufps_avx(auVar276,auVar276,0xc9);
                          auVar163._0_4_ = auVar80._0_4_ * auVar162._0_4_;
                          auVar163._4_4_ = auVar80._4_4_ * auVar162._4_4_;
                          auVar163._8_4_ = auVar80._8_4_ * auVar162._8_4_;
                          auVar163._12_4_ = auVar80._12_4_ * auVar162._12_4_;
                          auVar182._0_4_ = auVar276._0_4_ * auVar167._0_4_;
                          auVar182._4_4_ = auVar276._4_4_ * auVar167._4_4_;
                          auVar182._8_4_ = auVar276._8_4_ * auVar167._8_4_;
                          auVar182._12_4_ = auVar276._12_4_ * auVar167._12_4_;
                          auVar110 = vsubps_avx(auVar182,auVar163);
                          auVar167 = vshufps_avx(auVar110,auVar110,0xc9);
                          auVar80 = vshufps_avx(auVar114,auVar114,0xc9);
                          auVar183._0_4_ = auVar80._0_4_ * auVar167._0_4_;
                          auVar183._4_4_ = auVar80._4_4_ * auVar167._4_4_;
                          auVar183._8_4_ = auVar80._8_4_ * auVar167._8_4_;
                          auVar183._12_4_ = auVar80._12_4_ * auVar167._12_4_;
                          auVar167 = vshufps_avx(auVar110,auVar110,0xd2);
                          auVar115._0_4_ = auVar114._0_4_ * auVar167._0_4_;
                          auVar115._4_4_ = auVar114._4_4_ * auVar167._4_4_;
                          auVar115._8_4_ = auVar114._8_4_ * auVar167._8_4_;
                          auVar115._12_4_ = auVar114._12_4_ * auVar167._12_4_;
                          auVar167 = vsubps_avx(auVar183,auVar115);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar175;
                            uVar1 = vextractps_avx(auVar167,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                            uVar1 = vextractps_avx(auVar167,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                            *(int *)(ray + k * 4 + 0xe0) = auVar167._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar176;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_940;
                            *(uint *)(ray + k * 4 + 0x120) = uVar69;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_710 = vshufps_avx(auVar79,auVar79,0x55);
                            auVar80 = vshufps_avx(auVar167,auVar167,0x55);
                            auStack_730 = vshufps_avx(auVar167,auVar167,0xaa);
                            local_720 = vshufps_avx(auVar167,auVar167,0);
                            local_740 = (RTCHitN  [16])auVar80;
                            local_700 = ZEXT816(0) << 0x20;
                            local_6f0 = local_760._0_8_;
                            uStack_6e8 = local_760._8_8_;
                            local_6e0 = local_750._0_8_;
                            uStack_6d8 = local_750._8_8_;
                            uVar73 = context->user->instID[0];
                            _local_6d0 = CONCAT44(uVar73,uVar73);
                            _uStack_6c8 = CONCAT44(uVar73,uVar73);
                            uVar73 = context->user->instPrimID[0];
                            auVar116._4_4_ = uVar73;
                            auVar116._0_4_ = uVar73;
                            auVar116._8_4_ = uVar73;
                            auVar116._12_4_ = uVar73;
                            auStack_6c0 = auVar116;
                            *(float *)(ray + k * 4 + 0x80) = fVar175;
                            local_8e0._0_16_ = *local_a48;
                            local_a78.valid = (int *)local_8e0;
                            local_a78.geometryUserPtr = pGVar4->userPtr;
                            local_a78.context = context->user;
                            local_a78.hit = local_740;
                            local_a78.N = 4;
                            auVar167 = *local_a48;
                            local_a78.ray = (RTCRayN *)ray;
                            if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar313 = ZEXT1664(auVar79);
                              auVar321 = ZEXT1664(auVar321._0_16_);
                              auVar326 = ZEXT464((uint)fVar156);
                              auVar331 = ZEXT1664(auVar88);
                              (*pGVar4->intersectionFilterN)(&local_a78);
                              auVar231._8_56_ = extraout_var;
                              auVar231._0_8_ = extraout_XMM1_Qa;
                              auVar116 = auVar231._0_16_;
                              auVar167 = local_8e0._0_16_;
                            }
                            if (auVar167 == (undefined1  [16])0x0) {
                              auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar167 = vpcmpeqd_avx(auVar116,auVar116);
                              auVar80 = auVar80 ^ auVar167;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              auVar88 = vpcmpeqd_avx(auVar80,auVar80);
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar313 = ZEXT1664(auVar313._0_16_);
                                auVar321 = ZEXT1664(auVar321._0_16_);
                                auVar326 = ZEXT1664(auVar326._0_16_);
                                auVar331 = ZEXT1664(auVar331._0_16_);
                                (*p_Var5)(&local_a78);
                                auVar88 = vpcmpeqd_avx(auVar88,auVar88);
                                auVar167 = local_8e0._0_16_;
                              }
                              auVar79 = vpcmpeqd_avx(auVar167,_DAT_01f7aa10);
                              auVar80 = auVar79 ^ auVar88;
                              if (auVar167 != (undefined1  [16])0x0) {
                                auVar79 = auVar79 ^ auVar88;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   local_a78.hit);
                                *(undefined1 (*) [16])(local_a78.ray + 0xc0) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x10));
                                *(undefined1 (*) [16])(local_a78.ray + 0xd0) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x20));
                                *(undefined1 (*) [16])(local_a78.ray + 0xe0) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x30));
                                *(undefined1 (*) [16])(local_a78.ray + 0xf0) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x40));
                                *(undefined1 (*) [16])(local_a78.ray + 0x100) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x50));
                                *(undefined1 (*) [16])(local_a78.ray + 0x110) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x60));
                                *(undefined1 (*) [16])(local_a78.ray + 0x120) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x70));
                                *(undefined1 (*) [16])(local_a78.ray + 0x130) = auVar167;
                                auVar167 = vmaskmovps_avx(auVar79,*(undefined1 (*) [16])
                                                                   (local_a78.hit + 0x80));
                                *(undefined1 (*) [16])(local_a78.ray + 0x140) = auVar167;
                              }
                            }
                            auVar85._8_8_ = 0x100000001;
                            auVar85._0_8_ = 0x100000001;
                            if ((auVar85 & auVar80) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar208;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar75 = lVar75 + -1;
              } while (lVar75 != 0);
              auVar95 = local_5a0;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar98._4_4_ = uVar1;
              auVar98._0_4_ = uVar1;
              auVar98._8_4_ = uVar1;
              auVar98._12_4_ = uVar1;
              auVar98._16_4_ = uVar1;
              auVar98._20_4_ = uVar1;
              auVar98._24_4_ = uVar1;
              auVar98._28_4_ = uVar1;
              auVar94 = vcmpps_avx(_local_9c0,auVar98,2);
              fVar156 = auVar94._28_4_;
              local_5a0 = vandps_avx(auVar94,local_5a0);
              auVar259 = ZEXT3264(local_5a0);
              auVar95 = auVar95 & auVar94;
            } while ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar95 >> 0x7f,0) != '\0') ||
                       (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar95 >> 0xbf,0) != '\0') ||
                     (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar95[0x1f] < '\0');
            auVar259 = ZEXT3264(local_380);
            fVar206 = (float)local_680._0_4_;
            fVar175 = (float)local_680._4_4_;
            fVar208 = fStack_678;
            fVar176 = fStack_674;
            fVar210 = fStack_670;
            fVar177 = fStack_66c;
            fVar220 = fStack_668;
            fVar232 = fStack_664;
          }
          auVar231 = ZEXT3264(_local_7c0);
          auVar129._0_4_ =
               (float)local_7e0._0_4_ * (float)local_820._0_4_ +
               local_7c0._0_4_ * (float)local_840._0_4_ +
               (float)local_800._0_4_ * (float)local_860._0_4_;
          auVar129._4_4_ =
               (float)local_7e0._4_4_ * (float)local_820._4_4_ +
               local_7c0._4_4_ * (float)local_840._4_4_ +
               (float)local_800._4_4_ * (float)local_860._4_4_;
          auVar129._8_4_ =
               fStack_7d8 * fStack_818 + local_7c0._8_4_ * fStack_838 + fStack_7f8 * fStack_858;
          auVar129._12_4_ =
               fStack_7d4 * fStack_814 + local_7c0._12_4_ * fStack_834 + fStack_7f4 * fStack_854;
          auVar129._16_4_ =
               fStack_7d0 * fStack_810 + local_7c0._16_4_ * fStack_830 + fStack_7f0 * fStack_850;
          auVar129._20_4_ =
               fStack_7cc * fStack_80c + local_7c0._20_4_ * fStack_82c + fStack_7ec * fStack_84c;
          auVar129._24_4_ =
               fStack_7c8 * fStack_808 + local_7c0._24_4_ * fStack_828 + fStack_7e8 * fStack_848;
          auVar129._28_4_ = fVar156 + fVar156 + auVar259._28_4_;
          auVar148._8_4_ = 0x7fffffff;
          auVar148._0_8_ = 0x7fffffff7fffffff;
          auVar148._12_4_ = 0x7fffffff;
          auVar148._16_4_ = 0x7fffffff;
          auVar148._20_4_ = 0x7fffffff;
          auVar148._24_4_ = 0x7fffffff;
          auVar148._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar129,auVar148);
          auVar149._8_4_ = 0x3e99999a;
          auVar149._0_8_ = 0x3e99999a3e99999a;
          auVar149._12_4_ = 0x3e99999a;
          auVar149._16_4_ = 0x3e99999a;
          auVar149._20_4_ = 0x3e99999a;
          auVar149._24_4_ = 0x3e99999a;
          auVar149._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar149,1);
          auVar95 = vorps_avx(auVar94,local_600);
          auVar150._0_4_ = (float)local_900._0_4_ + fVar206;
          auVar150._4_4_ = (float)local_900._4_4_ + fVar175;
          auVar150._8_4_ = fStack_8f8 + fVar208;
          auVar150._12_4_ = fStack_8f4 + fVar176;
          auVar150._16_4_ = fStack_8f0 + fVar210;
          auVar150._20_4_ = fStack_8ec + fVar177;
          auVar150._24_4_ = fStack_8e8 + fVar220;
          auVar150._28_4_ = fStack_8e4 + fVar232;
          auVar94 = vcmpps_avx(auVar150,auVar98,2);
          _local_860 = vandps_avx(auVar94,_local_6a0);
          auVar151._8_4_ = 3;
          auVar151._0_8_ = 0x300000003;
          auVar151._12_4_ = 3;
          auVar151._16_4_ = 3;
          auVar151._20_4_ = 3;
          auVar151._24_4_ = 3;
          auVar151._28_4_ = 3;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar174,auVar151,auVar95);
          auVar167 = vpcmpgtd_avx(auVar94._16_16_,local_640._0_16_);
          auVar80 = vpshufd_avx(local_620._0_16_,0);
          auVar80 = vpcmpgtd_avx(auVar94._0_16_,auVar80);
          auVar152._16_16_ = auVar167;
          auVar152._0_16_ = auVar98._0_16_;
          _local_840 = vblendps_avx(ZEXT1632(auVar80),auVar152,0xf0);
          auVar94 = vandnps_avx(_local_840,_local_860);
          auVar95 = _local_860 & ~_local_840;
          local_8e0 = auVar94;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            local_820._4_4_ = (float)local_900._4_4_ + local_380._4_4_;
            local_820._0_4_ = (float)local_900._0_4_ + local_380._0_4_;
            fStack_818 = fStack_8f8 + local_380._8_4_;
            fStack_814 = fStack_8f4 + local_380._12_4_;
            fStack_810 = fStack_8f0 + local_380._16_4_;
            fStack_80c = fStack_8ec + local_380._20_4_;
            fStack_808 = fStack_8e8 + local_380._24_4_;
            fStack_804 = fStack_8e4 + local_380._28_4_;
            _local_9c0 = local_380;
            do {
              auVar100._8_4_ = 0x7f800000;
              auVar100._0_8_ = 0x7f8000007f800000;
              auVar100._12_4_ = 0x7f800000;
              auVar100._16_4_ = 0x7f800000;
              auVar100._20_4_ = 0x7f800000;
              auVar100._24_4_ = 0x7f800000;
              auVar100._28_4_ = 0x7f800000;
              auVar95 = vblendvps_avx(auVar100,_local_9c0,auVar94);
              auVar19 = vshufps_avx(auVar95,auVar95,0xb1);
              auVar19 = vminps_avx(auVar95,auVar19);
              auVar345 = vshufpd_avx(auVar19,auVar19,5);
              auVar19 = vminps_avx(auVar19,auVar345);
              auVar345 = vperm2f128_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar19,auVar345);
              auVar19 = vcmpps_avx(auVar95,auVar19,0);
              auVar345 = auVar94 & auVar19;
              auVar95 = auVar94;
              if ((((((((auVar345 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar345 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar345 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar345 >> 0x7f,0) != '\0') ||
                    (auVar345 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar345 >> 0xbf,0) != '\0') ||
                  (auVar345 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar345[0x1f] < '\0') {
                auVar95 = vandps_avx(auVar19,auVar94);
              }
              uVar70 = vmovmskps_avx(auVar95);
              uVar73 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
                }
              }
              uVar71 = (ulong)uVar73;
              local_8e0 = auVar94;
              *(undefined4 *)(local_8e0 + uVar71 * 4) = 0;
              fVar156 = local_1c0[uVar71];
              uVar73 = *(uint *)(local_360 + uVar71 * 4);
              fVar206 = auVar8._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                fVar206 = sqrtf((float)local_9e0._0_4_);
              }
              auVar80 = vminps_avx(auVar11,auVar81);
              auVar167 = vmaxps_avx(auVar11,auVar81);
              auVar88 = vminps_avx(auVar9,auVar10);
              auVar79 = vminps_avx(auVar80,auVar88);
              auVar80 = vmaxps_avx(auVar9,auVar10);
              auVar88 = vmaxps_avx(auVar167,auVar80);
              auVar164._8_4_ = 0x7fffffff;
              auVar164._0_8_ = 0x7fffffff7fffffff;
              auVar164._12_4_ = 0x7fffffff;
              auVar167 = vandps_avx(auVar79,auVar164);
              auVar80 = vandps_avx(auVar88,auVar164);
              auVar167 = vmaxps_avx(auVar167,auVar80);
              auVar80 = vmovshdup_avx(auVar167);
              auVar80 = vmaxss_avx(auVar80,auVar167);
              auVar167 = vshufpd_avx(auVar167,auVar167,1);
              auVar167 = vmaxss_avx(auVar167,auVar80);
              local_960 = auVar167._0_4_ * 1.9073486e-06;
              local_920._0_4_ = fVar206 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar88,auVar88,0xff);
              auVar167 = vinsertps_avx(ZEXT416(uVar73),ZEXT416((uint)fVar156),0x10);
              auVar313 = ZEXT1664(auVar167);
              lVar75 = 5;
              do {
                auVar110 = auVar313._0_16_;
                auVar167 = vmovshdup_avx(auVar110);
                fVar156 = auVar167._0_4_;
                fVar176 = 1.0 - fVar156;
                fVar206 = fVar176 * fVar176 * fVar176;
                fVar175 = fVar156 * fVar156 * fVar156;
                fVar208 = fVar156 * fVar176;
                auVar167 = vshufps_avx(ZEXT416((uint)(fVar175 * 0.16666667)),
                                       ZEXT416((uint)(fVar175 * 0.16666667)),0);
                auVar80 = ZEXT416((uint)((fVar175 * 4.0 + fVar206 +
                                         fVar156 * fVar208 * 12.0 + fVar176 * fVar208 * 6.0) *
                                        0.16666667));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar88 = ZEXT416((uint)((fVar206 * 4.0 + fVar175 +
                                         fVar176 * fVar208 * 12.0 + fVar156 * fVar208 * 6.0) *
                                        0.16666667));
                auVar88 = vshufps_avx(auVar88,auVar88,0);
                auVar79 = vshufps_avx(auVar110,auVar110,0);
                auVar140._0_4_ = auVar79._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar140._4_4_ = auVar79._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar140._8_4_ = auVar79._8_4_ * fStack_9c8 + 0.0;
                auVar140._12_4_ = auVar79._12_4_ * fStack_9c4 + 0.0;
                auVar79 = vshufps_avx(ZEXT416((uint)(fVar206 * 0.16666667)),
                                      ZEXT416((uint)(fVar206 * 0.16666667)),0);
                auVar86._0_4_ =
                     auVar79._0_4_ * local_a90 +
                     auVar88._0_4_ * local_ab0 +
                     auVar167._0_4_ * local_ac0 + auVar80._0_4_ * local_aa0;
                auVar86._4_4_ =
                     auVar79._4_4_ * fStack_a8c +
                     auVar88._4_4_ * fStack_aac +
                     auVar167._4_4_ * fStack_abc + auVar80._4_4_ * fStack_a9c;
                auVar86._8_4_ =
                     auVar79._8_4_ * fStack_a88 +
                     auVar88._8_4_ * fStack_aa8 +
                     auVar167._8_4_ * fStack_ab8 + auVar80._8_4_ * fStack_a98;
                auVar86._12_4_ =
                     auVar79._12_4_ * fStack_a84 +
                     auVar88._12_4_ * fStack_aa4 +
                     auVar167._12_4_ * fStack_ab4 + auVar80._12_4_ * fStack_a94;
                local_a40._0_16_ = auVar86;
                auVar167 = vsubps_avx(auVar140,auVar86);
                local_980 = auVar167._0_4_;
                fStack_97c = auVar167._4_4_;
                fStack_978 = auVar167._8_4_;
                fStack_974 = auVar167._12_4_;
                auVar167 = vdpps_avx(auVar167,auVar167,0x7f);
                fVar206 = auVar167._0_4_;
                local_be0 = auVar313._0_4_;
                if (fVar206 < 0.0) {
                  fVar175 = sqrtf(fVar206);
                }
                else {
                  auVar80 = vsqrtss_avx(auVar167,auVar167);
                  fVar175 = auVar80._0_4_;
                }
                auVar80 = ZEXT416((uint)(fVar156 * fVar156 * 0.5));
                auVar80 = vshufps_avx(auVar80,auVar80,0);
                auVar88 = ZEXT416((uint)((fVar176 * fVar176 + fVar208 * 4.0) * 0.5));
                auVar88 = vshufps_avx(auVar88,auVar88,0);
                auVar79 = ZEXT416((uint)((fVar156 * -fVar156 - fVar208 * 4.0) * 0.5));
                auVar79 = vshufps_avx(auVar79,auVar79,0);
                auVar87 = ZEXT416((uint)(fVar176 * -fVar176 * 0.5));
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                auVar277._0_4_ =
                     local_a90 * auVar87._0_4_ +
                     local_ab0 * auVar79._0_4_ +
                     local_ac0 * auVar80._0_4_ + local_aa0 * auVar88._0_4_;
                auVar277._4_4_ =
                     fStack_a8c * auVar87._4_4_ +
                     fStack_aac * auVar79._4_4_ +
                     fStack_abc * auVar80._4_4_ + fStack_a9c * auVar88._4_4_;
                auVar277._8_4_ =
                     fStack_a88 * auVar87._8_4_ +
                     fStack_aa8 * auVar79._8_4_ +
                     fStack_ab8 * auVar80._8_4_ + fStack_a98 * auVar88._8_4_;
                auVar277._12_4_ =
                     fStack_a84 * auVar87._12_4_ +
                     fStack_aa4 * auVar79._12_4_ +
                     fStack_ab4 * auVar80._12_4_ + fStack_a94 * auVar88._12_4_;
                auVar80 = vshufps_avx(auVar110,auVar110,0x55);
                auVar88 = ZEXT416((uint)(fVar176 - (fVar156 + fVar156)));
                auVar79 = vshufps_avx(auVar88,auVar88,0);
                auVar88 = ZEXT416((uint)(fVar156 - (fVar176 + fVar176)));
                auVar87 = vshufps_avx(auVar88,auVar88,0);
                auVar135 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
                auVar88 = vdpps_avx(auVar277,auVar277,0x7f);
                auVar117._0_4_ =
                     local_a90 * auVar135._0_4_ +
                     local_ab0 * auVar87._0_4_ +
                     local_ac0 * auVar80._0_4_ + local_aa0 * auVar79._0_4_;
                auVar117._4_4_ =
                     fStack_a8c * auVar135._4_4_ +
                     fStack_aac * auVar87._4_4_ +
                     fStack_abc * auVar80._4_4_ + fStack_a9c * auVar79._4_4_;
                auVar117._8_4_ =
                     fStack_a88 * auVar135._8_4_ +
                     fStack_aa8 * auVar87._8_4_ +
                     fStack_ab8 * auVar80._8_4_ + fStack_a98 * auVar79._8_4_;
                auVar117._12_4_ =
                     fStack_a84 * auVar135._12_4_ +
                     fStack_aa4 * auVar87._12_4_ +
                     fStack_ab4 * auVar80._12_4_ + fStack_a94 * auVar79._12_4_;
                auVar80 = vblendps_avx(auVar88,_DAT_01f7aa10,0xe);
                auVar79 = vrsqrtss_avx(auVar80,auVar80);
                fVar208 = auVar79._0_4_;
                fVar156 = auVar88._0_4_;
                auVar79 = vdpps_avx(auVar277,auVar117,0x7f);
                auVar87 = vshufps_avx(auVar88,auVar88,0);
                auVar118._0_4_ = auVar117._0_4_ * auVar87._0_4_;
                auVar118._4_4_ = auVar117._4_4_ * auVar87._4_4_;
                auVar118._8_4_ = auVar117._8_4_ * auVar87._8_4_;
                auVar118._12_4_ = auVar117._12_4_ * auVar87._12_4_;
                auVar79 = vshufps_avx(auVar79,auVar79,0);
                auVar184._0_4_ = auVar277._0_4_ * auVar79._0_4_;
                auVar184._4_4_ = auVar277._4_4_ * auVar79._4_4_;
                auVar184._8_4_ = auVar277._8_4_ * auVar79._8_4_;
                auVar184._12_4_ = auVar277._12_4_ * auVar79._12_4_;
                auVar135 = vsubps_avx(auVar118,auVar184);
                auVar79 = vrcpss_avx(auVar80,auVar80);
                auVar80 = vmaxss_avx(ZEXT416((uint)local_960),
                                     ZEXT416((uint)(local_be0 * (float)local_920._0_4_)));
                auVar321 = ZEXT1664(auVar80);
                auVar79 = ZEXT416((uint)(auVar79._0_4_ * (2.0 - fVar156 * auVar79._0_4_)));
                auVar79 = vshufps_avx(auVar79,auVar79,0);
                uVar71 = CONCAT44(auVar277._4_4_,auVar277._0_4_);
                auVar197._0_8_ = uVar71 ^ 0x8000000080000000;
                auVar197._8_4_ = -auVar277._8_4_;
                auVar197._12_4_ = -auVar277._12_4_;
                auVar87 = ZEXT416((uint)(fVar208 * 1.5 +
                                        fVar156 * -0.5 * fVar208 * fVar208 * fVar208));
                auVar87 = vshufps_avx(auVar87,auVar87,0);
                auVar165._0_4_ = auVar87._0_4_ * auVar135._0_4_ * auVar79._0_4_;
                auVar165._4_4_ = auVar87._4_4_ * auVar135._4_4_ * auVar79._4_4_;
                auVar165._8_4_ = auVar87._8_4_ * auVar135._8_4_ * auVar79._8_4_;
                auVar165._12_4_ = auVar87._12_4_ * auVar135._12_4_ * auVar79._12_4_;
                auVar223._0_4_ = auVar277._0_4_ * auVar87._0_4_;
                auVar223._4_4_ = auVar277._4_4_ * auVar87._4_4_;
                auVar223._8_4_ = auVar277._8_4_ * auVar87._8_4_;
                auVar223._12_4_ = auVar277._12_4_ * auVar87._12_4_;
                if (fVar156 < 0.0) {
                  local_a00._0_16_ = auVar165;
                  fVar156 = sqrtf(fVar156);
                  auVar321 = ZEXT464(auVar80._0_4_);
                  auVar165 = local_a00._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar156 = auVar88._0_4_;
                }
                auVar64._4_4_ = fStack_97c;
                auVar64._0_4_ = local_980;
                auVar64._8_4_ = fStack_978;
                auVar64._12_4_ = fStack_974;
                auVar88 = vdpps_avx(auVar64,auVar223,0x7f);
                fVar156 = (local_960 / fVar156) * (fVar175 + 1.0) +
                          auVar321._0_4_ + fVar175 * local_960;
                auVar79 = vdpps_avx(auVar197,auVar223,0x7f);
                auVar87 = vdpps_avx(auVar64,auVar165,0x7f);
                auVar135 = vdpps_avx(_local_9d0,auVar223,0x7f);
                auVar136 = vdpps_avx(auVar64,auVar197,0x7f);
                fVar175 = auVar79._0_4_ + auVar87._0_4_;
                fVar208 = auVar88._0_4_;
                auVar89._0_4_ = fVar208 * fVar208;
                auVar89._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar89._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar89._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar87 = vsubps_avx(auVar167,auVar89);
                auVar79 = vdpps_avx(auVar64,_local_9d0,0x7f);
                fVar176 = auVar136._0_4_ - fVar208 * fVar175;
                fVar210 = auVar79._0_4_ - fVar208 * auVar135._0_4_;
                auVar79 = vrsqrtss_avx(auVar87,auVar87);
                fVar177 = auVar87._0_4_;
                fVar208 = auVar79._0_4_;
                fVar208 = fVar208 * 1.5 + fVar177 * -0.5 * fVar208 * fVar208 * fVar208;
                if (fVar177 < 0.0) {
                  local_a00._0_16_ = ZEXT416((uint)fVar175);
                  local_780._0_4_ = fVar176;
                  local_a20._0_4_ = fVar210;
                  local_9a0._0_4_ = fVar208;
                  fVar177 = sqrtf(fVar177);
                  auVar321 = ZEXT464(auVar80._0_4_);
                  fVar208 = (float)local_9a0._0_4_;
                  fVar176 = (float)local_780._0_4_;
                  fVar210 = (float)local_a20._0_4_;
                  auVar80 = local_a00._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar87,auVar87);
                  fVar177 = auVar80._0_4_;
                  auVar80 = ZEXT416((uint)fVar175);
                }
                auVar331 = ZEXT1664(auVar88);
                auVar326 = ZEXT464((uint)fVar156);
                auVar90 = vpermilps_avx(local_a40._0_16_,0xff);
                auVar136 = vshufps_avx(auVar277,auVar277,0xff);
                fVar176 = fVar176 * fVar208 - auVar136._0_4_;
                auVar185._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar135._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar135._12_4_ ^ 0x80000000;
                auVar198._0_4_ = -fVar176;
                auVar198._4_4_ = 0x80000000;
                auVar198._8_4_ = 0x80000000;
                auVar198._12_4_ = 0x80000000;
                fVar175 = auVar80._0_4_ * fVar210 * fVar208;
                auVar231 = ZEXT464((uint)fVar175);
                auVar79 = vinsertps_avx(auVar198,ZEXT416((uint)(fVar210 * fVar208)),0x1c);
                auVar87 = vmovsldup_avx(ZEXT416((uint)(fVar175 - auVar135._0_4_ * fVar176)));
                auVar79 = vdivps_avx(auVar79,auVar87);
                auVar80 = vinsertps_avx(auVar80,auVar185,0x10);
                auVar80 = vdivps_avx(auVar80,auVar87);
                auVar87 = vmovsldup_avx(auVar88);
                auVar90 = ZEXT416((uint)(fVar177 - auVar90._0_4_));
                auVar135 = vmovsldup_avx(auVar90);
                auVar141._0_4_ = auVar87._0_4_ * auVar79._0_4_ + auVar135._0_4_ * auVar80._0_4_;
                auVar141._4_4_ = auVar87._4_4_ * auVar79._4_4_ + auVar135._4_4_ * auVar80._4_4_;
                auVar141._8_4_ = auVar87._8_4_ * auVar79._8_4_ + auVar135._8_4_ * auVar80._8_4_;
                auVar141._12_4_ = auVar87._12_4_ * auVar79._12_4_ + auVar135._12_4_ * auVar80._12_4_
                ;
                auVar79 = vsubps_avx(auVar110,auVar141);
                auVar313 = ZEXT1664(auVar79);
                auVar142._8_4_ = 0x7fffffff;
                auVar142._0_8_ = 0x7fffffff7fffffff;
                auVar142._12_4_ = 0x7fffffff;
                auVar80 = vandps_avx(auVar88,auVar142);
                if (auVar80._0_4_ < fVar156) {
                  auVar166._8_4_ = 0x7fffffff;
                  auVar166._0_8_ = 0x7fffffff7fffffff;
                  auVar166._12_4_ = 0x7fffffff;
                  auVar80 = vandps_avx(auVar90,auVar166);
                  if (auVar80._0_4_ <
                      (float)local_7a0._0_4_ * 1.9073486e-06 + auVar321._0_4_ + fVar156) {
                    fVar175 = auVar79._0_4_ + (float)local_8b0._0_4_;
                    if (fVar190 <= fVar175) {
                      fVar208 = *(float *)(ray + k * 4 + 0x80);
                      auVar231 = ZEXT464((uint)fVar208);
                      if (fVar175 <= fVar208) {
                        auVar80 = vmovshdup_avx(auVar79);
                        fVar176 = auVar80._0_4_;
                        if ((0.0 <= fVar176) && (fVar176 <= 1.0)) {
                          auVar167 = vrsqrtss_avx(auVar167,auVar167);
                          fVar210 = auVar167._0_4_;
                          pGVar4 = (context->scene->geometries).items[uVar69].ptr;
                          if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            auVar167 = ZEXT416((uint)(fVar210 * 1.5 +
                                                     fVar206 * -0.5 * fVar210 * fVar210 * fVar210));
                            auVar167 = vshufps_avx(auVar167,auVar167,0);
                            auVar168._0_4_ = auVar167._0_4_ * local_980;
                            auVar168._4_4_ = auVar167._4_4_ * fStack_97c;
                            auVar168._8_4_ = auVar167._8_4_ * fStack_978;
                            auVar168._12_4_ = auVar167._12_4_ * fStack_974;
                            auVar119._0_4_ = auVar277._0_4_ + auVar136._0_4_ * auVar168._0_4_;
                            auVar119._4_4_ = auVar277._4_4_ + auVar136._4_4_ * auVar168._4_4_;
                            auVar119._8_4_ = auVar277._8_4_ + auVar136._8_4_ * auVar168._8_4_;
                            auVar119._12_4_ = auVar277._12_4_ + auVar136._12_4_ * auVar168._12_4_;
                            auVar167 = vshufps_avx(auVar168,auVar168,0xc9);
                            auVar80 = vshufps_avx(auVar277,auVar277,0xc9);
                            auVar169._0_4_ = auVar80._0_4_ * auVar168._0_4_;
                            auVar169._4_4_ = auVar80._4_4_ * auVar168._4_4_;
                            auVar169._8_4_ = auVar80._8_4_ * auVar168._8_4_;
                            auVar169._12_4_ = auVar80._12_4_ * auVar168._12_4_;
                            auVar186._0_4_ = auVar277._0_4_ * auVar167._0_4_;
                            auVar186._4_4_ = auVar277._4_4_ * auVar167._4_4_;
                            auVar186._8_4_ = auVar277._8_4_ * auVar167._8_4_;
                            auVar186._12_4_ = auVar277._12_4_ * auVar167._12_4_;
                            auVar110 = vsubps_avx(auVar186,auVar169);
                            auVar167 = vshufps_avx(auVar110,auVar110,0xc9);
                            auVar80 = vshufps_avx(auVar119,auVar119,0xc9);
                            auVar187._0_4_ = auVar80._0_4_ * auVar167._0_4_;
                            auVar187._4_4_ = auVar80._4_4_ * auVar167._4_4_;
                            auVar187._8_4_ = auVar80._8_4_ * auVar167._8_4_;
                            auVar187._12_4_ = auVar80._12_4_ * auVar167._12_4_;
                            auVar167 = vshufps_avx(auVar110,auVar110,0xd2);
                            auVar120._0_4_ = auVar119._0_4_ * auVar167._0_4_;
                            auVar120._4_4_ = auVar119._4_4_ * auVar167._4_4_;
                            auVar120._8_4_ = auVar119._8_4_ * auVar167._8_4_;
                            auVar120._12_4_ = auVar119._12_4_ * auVar167._12_4_;
                            auVar167 = vsubps_avx(auVar187,auVar120);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar175;
                              uVar1 = vextractps_avx(auVar167,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                              uVar1 = vextractps_avx(auVar167,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                              *(int *)(ray + k * 4 + 0xe0) = auVar167._0_4_;
                              *(float *)(ray + k * 4 + 0xf0) = fVar176;
                              *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                              *(int *)(ray + k * 4 + 0x110) = (int)local_940;
                              *(uint *)(ray + k * 4 + 0x120) = uVar69;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              local_710 = vshufps_avx(auVar79,auVar79,0x55);
                              auVar80 = vshufps_avx(auVar167,auVar167,0x55);
                              auStack_730 = vshufps_avx(auVar167,auVar167,0xaa);
                              local_720 = vshufps_avx(auVar167,auVar167,0);
                              local_740 = (RTCHitN  [16])auVar80;
                              local_700 = ZEXT816(0) << 0x20;
                              local_6f0 = local_760._0_8_;
                              uStack_6e8 = local_760._8_8_;
                              local_6e0 = local_750._0_8_;
                              uStack_6d8 = local_750._8_8_;
                              uVar73 = context->user->instID[0];
                              _local_6d0 = CONCAT44(uVar73,uVar73);
                              _uStack_6c8 = CONCAT44(uVar73,uVar73);
                              uVar73 = context->user->instPrimID[0];
                              auVar121._4_4_ = uVar73;
                              auVar121._0_4_ = uVar73;
                              auVar121._8_4_ = uVar73;
                              auVar121._12_4_ = uVar73;
                              auStack_6c0 = auVar121;
                              *(float *)(ray + k * 4 + 0x80) = fVar175;
                              local_8a0 = *local_a48;
                              local_a78.valid = (int *)local_8a0;
                              local_a78.geometryUserPtr = pGVar4->userPtr;
                              local_a78.context = context->user;
                              local_a78.hit = local_740;
                              local_a78.N = 4;
                              local_a78.ray = (RTCRayN *)ray;
                              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar313 = ZEXT1664(auVar79);
                                auVar321 = ZEXT1664(auVar321._0_16_);
                                auVar326 = ZEXT464((uint)fVar156);
                                auVar331 = ZEXT1664(auVar88);
                                (*pGVar4->intersectionFilterN)(&local_a78);
                                auVar259._8_56_ = extraout_var_00;
                                auVar259._0_8_ = extraout_XMM1_Qa_00;
                                auVar121 = auVar259._0_16_;
                              }
                              if (local_8a0 == (undefined1  [16])0x0) {
                                auVar167 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar80 = vpcmpeqd_avx(auVar121,auVar121);
                                auVar167 = auVar167 ^ auVar80;
                              }
                              else {
                                p_Var5 = context->args->filter;
                                auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar313 = ZEXT1664(auVar313._0_16_);
                                  auVar321 = ZEXT1664(auVar321._0_16_);
                                  auVar326 = ZEXT1664(auVar326._0_16_);
                                  auVar331 = ZEXT1664(auVar331._0_16_);
                                  (*p_Var5)(&local_a78);
                                  auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                                }
                                auVar88 = vpcmpeqd_avx(local_8a0,_DAT_01f7aa10);
                                auVar167 = auVar88 ^ auVar80;
                                if (local_8a0 != (undefined1  [16])0x0) {
                                  auVar88 = auVar88 ^ auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    local_a78.hit);
                                  *(undefined1 (*) [16])(local_a78.ray + 0xc0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x10));
                                  *(undefined1 (*) [16])(local_a78.ray + 0xd0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x20));
                                  *(undefined1 (*) [16])(local_a78.ray + 0xe0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x30));
                                  *(undefined1 (*) [16])(local_a78.ray + 0xf0) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x40));
                                  *(undefined1 (*) [16])(local_a78.ray + 0x100) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x50));
                                  *(undefined1 (*) [16])(local_a78.ray + 0x110) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x60));
                                  *(undefined1 (*) [16])(local_a78.ray + 0x120) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x70));
                                  *(undefined1 (*) [16])(local_a78.ray + 0x130) = auVar80;
                                  auVar80 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                    (local_a78.hit + 0x80));
                                  *(undefined1 (*) [16])(local_a78.ray + 0x140) = auVar80;
                                }
                              }
                              auVar231 = ZEXT464((uint)fVar208);
                              auVar91._8_8_ = 0x100000001;
                              auVar91._0_8_ = 0x100000001;
                              if ((auVar91 & auVar167) == (undefined1  [16])0x0) {
                                *(float *)(ray + k * 4 + 0x80) = fVar208;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar75 = lVar75 + -1;
              } while (lVar75 != 0);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar98._4_4_ = uVar1;
              auVar98._0_4_ = uVar1;
              auVar98._8_4_ = uVar1;
              auVar98._12_4_ = uVar1;
              auVar98._16_4_ = uVar1;
              auVar98._20_4_ = uVar1;
              auVar98._24_4_ = uVar1;
              auVar98._28_4_ = uVar1;
              auVar95 = vcmpps_avx(_local_820,auVar98,2);
              auVar94 = vandps_avx(auVar95,local_8e0);
              auVar95 = local_8e0 & auVar95;
            } while ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar95 >> 0x7f,0) != '\0') ||
                       (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar95 >> 0xbf,0) != '\0') ||
                     (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar95[0x1f] < '\0');
            local_8e0 = auVar94;
          }
          auVar94 = vandps_avx(_local_5e0,local_5c0);
          auVar95 = vandps_avx(_local_860,_local_840);
          auVar259 = ZEXT3264(_local_900);
          auVar188._0_4_ = local_900._0_4_ + local_3c0._0_4_;
          auVar188._4_4_ = local_900._4_4_ + local_3c0._4_4_;
          auVar188._8_4_ = local_900._8_4_ + local_3c0._8_4_;
          auVar188._12_4_ = local_900._12_4_ + local_3c0._12_4_;
          auVar188._16_4_ = local_900._16_4_ + local_3c0._16_4_;
          auVar188._20_4_ = local_900._20_4_ + local_3c0._20_4_;
          auVar188._24_4_ = local_900._24_4_ + local_3c0._24_4_;
          auVar188._28_4_ = local_900._28_4_ + local_3c0._28_4_;
          auVar19 = vcmpps_avx(auVar188,auVar98,2);
          auVar94 = vandps_avx(auVar19,auVar94);
          auVar189._0_4_ = local_380._0_4_ + local_900._0_4_;
          auVar189._4_4_ = local_380._4_4_ + local_900._4_4_;
          auVar189._8_4_ = local_380._8_4_ + local_900._8_4_;
          auVar189._12_4_ = local_380._12_4_ + local_900._12_4_;
          auVar189._16_4_ = local_380._16_4_ + local_900._16_4_;
          auVar189._20_4_ = local_380._20_4_ + local_900._20_4_;
          auVar189._24_4_ = local_380._24_4_ + local_900._24_4_;
          auVar189._28_4_ = local_380._28_4_ + local_900._28_4_;
          auVar19 = vcmpps_avx(auVar189,auVar98,2);
          auVar95 = vandps_avx(auVar19,auVar95);
          auVar95 = vorps_avx(auVar94,auVar95);
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar95;
            auVar94 = vblendvps_avx(local_380,_local_3c0,auVar94);
            *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar94;
            uVar2 = vmovlps_avx(local_570);
            (&uStack_140)[uVar76 * 0xc] = uVar2;
            aiStack_138[uVar76 * 0x18] = local_be8 + 1;
            iVar78 = iVar78 + 1;
          }
        }
      }
    }
    if (iVar78 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar101._4_4_ = uVar1;
    auVar101._0_4_ = uVar1;
    auVar101._8_4_ = uVar1;
    auVar101._12_4_ = uVar1;
    auVar101._16_4_ = uVar1;
    auVar101._20_4_ = uVar1;
    auVar101._24_4_ = uVar1;
    auVar101._28_4_ = uVar1;
    uVar73 = -iVar78;
    pauVar72 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar78 - 1) * 0x60);
    while( true ) {
      auVar94 = pauVar72[1];
      auVar130._0_4_ = (float)local_900._0_4_ + auVar94._0_4_;
      auVar130._4_4_ = (float)local_900._4_4_ + auVar94._4_4_;
      auVar130._8_4_ = fStack_8f8 + auVar94._8_4_;
      auVar130._12_4_ = fStack_8f4 + auVar94._12_4_;
      auVar130._16_4_ = fStack_8f0 + auVar94._16_4_;
      auVar130._20_4_ = fStack_8ec + auVar94._20_4_;
      auVar130._24_4_ = fStack_8e8 + auVar94._24_4_;
      auVar130._28_4_ = fStack_8e4 + auVar94._28_4_;
      auVar19 = vcmpps_avx(auVar130,auVar101,2);
      auVar95 = vandps_avx(auVar19,*pauVar72);
      _local_740 = auVar95;
      auVar19 = *pauVar72 & auVar19;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') break;
      pauVar72 = pauVar72 + -3;
      uVar73 = uVar73 + 1;
      if (uVar73 == 0) goto LAB_00ec56e6;
    }
    auVar102._8_4_ = 0x7f800000;
    auVar102._0_8_ = 0x7f8000007f800000;
    auVar102._12_4_ = 0x7f800000;
    auVar102._16_4_ = 0x7f800000;
    auVar102._20_4_ = 0x7f800000;
    auVar102._24_4_ = 0x7f800000;
    auVar102._28_4_ = 0x7f800000;
    auVar94 = vblendvps_avx(auVar102,auVar94,auVar95);
    auVar19 = vshufps_avx(auVar94,auVar94,0xb1);
    auVar19 = vminps_avx(auVar94,auVar19);
    auVar345 = vshufpd_avx(auVar19,auVar19,5);
    auVar19 = vminps_avx(auVar19,auVar345);
    auVar345 = vperm2f128_avx(auVar19,auVar19,1);
    auVar19 = vminps_avx(auVar19,auVar345);
    auVar94 = vcmpps_avx(auVar94,auVar19,0);
    auVar19 = auVar95 & auVar94;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar95 = vandps_avx(auVar94,auVar95);
    }
    auVar92._8_8_ = 0;
    auVar92._0_8_ = *(ulong *)pauVar72[2];
    local_be8 = *(uint *)(pauVar72[2] + 8);
    uVar74 = vmovmskps_avx(auVar95);
    uVar70 = 0;
    if (uVar74 != 0) {
      for (; (uVar74 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
      }
    }
    *(undefined4 *)(local_740 + (ulong)uVar70 * 4) = 0;
    *pauVar72 = _local_740;
    uVar74 = ~uVar73;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar74 = -uVar73;
    }
    uVar76 = (ulong)uVar74;
    auVar167 = vshufps_avx(auVar92,auVar92,0);
    auVar80 = vshufps_avx(auVar92,auVar92,0x55);
    auVar80 = vsubps_avx(auVar80,auVar167);
    local_3c0._4_4_ = auVar167._4_4_ + auVar80._4_4_ * 0.14285715;
    local_3c0._0_4_ = auVar167._0_4_ + auVar80._0_4_ * 0.0;
    fStack_3b8 = auVar167._8_4_ + auVar80._8_4_ * 0.2857143;
    fStack_3b4 = auVar167._12_4_ + auVar80._12_4_ * 0.42857146;
    fStack_3b0 = auVar167._0_4_ + auVar80._0_4_ * 0.5714286;
    fStack_3ac = auVar167._4_4_ + auVar80._4_4_ * 0.71428573;
    fStack_3a8 = auVar167._8_4_ + auVar80._8_4_ * 0.8571429;
    fStack_3a4 = auVar167._12_4_ + auVar80._12_4_;
    local_570._8_8_ = 0;
    local_570._0_8_ = *(ulong *)(local_3c0 + (ulong)uVar70 * 4);
  } while( true );
LAB_00ec56e6:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar1;
  auVar93._0_4_ = uVar1;
  auVar93._8_4_ = uVar1;
  auVar93._12_4_ = uVar1;
  auVar111 = vcmpps_avx(local_580,auVar93,2);
  uVar69 = vmovmskps_avx(auVar111);
  uVar69 = (uint)uVar77 & uVar69;
  if (uVar69 == 0) {
    return;
  }
  goto LAB_00ec2a36;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }